

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<8,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  uint uVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  void *pvVar12;
  __int_type_conflict _Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  uint uVar59;
  int iVar60;
  ulong uVar61;
  long lVar62;
  byte bVar63;
  uint uVar64;
  uint uVar65;
  ulong uVar66;
  ulong uVar67;
  uint uVar68;
  float t1;
  float fVar69;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined4 uVar70;
  float fVar94;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar71;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar72;
  float fVar93;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined8 uVar95;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar113;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar139;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar148;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vfloat4 b0;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar163;
  float fVar164;
  float fVar182;
  float fVar183;
  vfloat4 b0_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar184;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar197;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar187 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar198;
  undefined1 auVar196 [32];
  float fVar202;
  float fVar203;
  float fVar214;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar215;
  float fVar231;
  vfloat4 a0_2;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar232;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  vfloat4 a0_3;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar248;
  vfloat4 a0_1;
  undefined1 auVar252 [16];
  undefined1 auVar249 [16];
  float fVar264;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar262;
  float fVar263;
  undefined1 in_ZMM12 [64];
  undefined1 auVar261 [64];
  vfloat4 a0;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar273 [16];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar288 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_780 [8];
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float local_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_700 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_620 [32];
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined4 local_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [16];
  uint auStack_4f0 [4];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 auStack_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar287 [32];
  
  PVar8 = prim[1];
  uVar67 = (ulong)(byte)PVar8;
  fVar69 = *(float *)(prim + uVar67 * 0x19 + 0x12);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar14 = vsubps_avx(auVar14,*(undefined1 (*) [16])(prim + uVar67 * 0x19 + 6));
  auVar252._0_4_ = fVar69 * auVar14._0_4_;
  auVar252._4_4_ = fVar69 * auVar14._4_4_;
  auVar252._8_4_ = fVar69 * auVar14._8_4_;
  auVar252._12_4_ = fVar69 * auVar14._12_4_;
  auVar154._0_4_ = fVar69 * auVar15._0_4_;
  auVar154._4_4_ = fVar69 * auVar15._4_4_;
  auVar154._8_4_ = fVar69 * auVar15._8_4_;
  auVar154._12_4_ = fVar69 * auVar15._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar67 * 4 + 6);
  auVar87 = vpmovsxbd_avx2(auVar14);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar67 * 5 + 6);
  auVar16 = vpmovsxbd_avx2(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + uVar67 * 6 + 6);
  auVar17 = vpmovsxbd_avx2(auVar132);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar67 * 0xb + 6);
  auVar18 = vpmovsxbd_avx2(auVar3);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6);
  auVar19 = vpmovsxbd_avx2(auVar4);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (uint)(byte)PVar8 * 0xc + uVar67 + 6);
  auVar20 = vpmovsxbd_avx2(auVar5);
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar61 = (ulong)(uint)((int)(uVar67 * 9) * 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar61 + 6);
  auVar21 = vpmovsxbd_avx2(auVar6);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar217._8_8_ = 0;
  auVar217._0_8_ = *(ulong *)(prim + uVar61 + uVar67 + 6);
  auVar22 = vpmovsxbd_avx2(auVar217);
  auVar22 = vcvtdq2ps_avx(auVar22);
  uVar61 = (ulong)(uint)((int)(uVar67 * 5) << 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar61 + 6);
  auVar260 = vpmovsxbd_avx2(auVar7);
  auVar260 = vcvtdq2ps_avx(auVar260);
  auVar277._4_4_ = auVar154._0_4_;
  auVar277._0_4_ = auVar154._0_4_;
  auVar277._8_4_ = auVar154._0_4_;
  auVar277._12_4_ = auVar154._0_4_;
  auVar277._16_4_ = auVar154._0_4_;
  auVar277._20_4_ = auVar154._0_4_;
  auVar277._24_4_ = auVar154._0_4_;
  auVar277._28_4_ = auVar154._0_4_;
  auVar14 = vmovshdup_avx(auVar154);
  uVar95 = auVar14._0_8_;
  auVar285._8_8_ = uVar95;
  auVar285._0_8_ = uVar95;
  auVar285._16_8_ = uVar95;
  auVar285._24_8_ = uVar95;
  auVar14 = vshufps_avx(auVar154,auVar154,0xaa);
  fVar69 = auVar14._0_4_;
  auVar261._0_4_ = fVar69 * auVar17._0_4_;
  fVar93 = auVar14._4_4_;
  auVar261._4_4_ = fVar93 * auVar17._4_4_;
  auVar261._8_4_ = fVar69 * auVar17._8_4_;
  auVar261._12_4_ = fVar93 * auVar17._12_4_;
  auVar261._16_4_ = fVar69 * auVar17._16_4_;
  auVar261._20_4_ = fVar93 * auVar17._20_4_;
  auVar261._28_36_ = in_ZMM12._28_36_;
  auVar261._24_4_ = fVar69 * auVar17._24_4_;
  auVar230._0_4_ = auVar20._0_4_ * fVar69;
  auVar230._4_4_ = auVar20._4_4_ * fVar93;
  auVar230._8_4_ = auVar20._8_4_ * fVar69;
  auVar230._12_4_ = auVar20._12_4_ * fVar93;
  auVar230._16_4_ = auVar20._16_4_ * fVar69;
  auVar230._20_4_ = auVar20._20_4_ * fVar93;
  auVar230._28_36_ = in_ZMM10._28_36_;
  auVar230._24_4_ = auVar20._24_4_ * fVar69;
  auVar228._0_4_ = auVar260._0_4_ * fVar69;
  auVar228._4_4_ = auVar260._4_4_ * fVar93;
  auVar228._8_4_ = auVar260._8_4_ * fVar69;
  auVar228._12_4_ = auVar260._12_4_ * fVar93;
  auVar228._16_4_ = auVar260._16_4_ * fVar69;
  auVar228._20_4_ = auVar260._20_4_ * fVar93;
  auVar228._24_4_ = auVar260._24_4_ * fVar69;
  auVar228._28_4_ = 0;
  auVar14 = vfmadd231ps_fma(auVar261._0_32_,auVar285,auVar16);
  auVar15 = vfmadd231ps_fma(auVar230._0_32_,auVar285,auVar19);
  auVar132 = vfmadd231ps_fma(auVar228,auVar22,auVar285);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar277,auVar87);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar277,auVar18);
  auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar21,auVar277);
  auVar278._4_4_ = auVar252._0_4_;
  auVar278._0_4_ = auVar252._0_4_;
  auVar278._8_4_ = auVar252._0_4_;
  auVar278._12_4_ = auVar252._0_4_;
  auVar278._16_4_ = auVar252._0_4_;
  auVar278._20_4_ = auVar252._0_4_;
  auVar278._24_4_ = auVar252._0_4_;
  auVar278._28_4_ = auVar252._0_4_;
  auVar14 = vmovshdup_avx(auVar252);
  uVar95 = auVar14._0_8_;
  auVar286._8_8_ = uVar95;
  auVar286._0_8_ = uVar95;
  auVar286._16_8_ = uVar95;
  auVar286._24_8_ = uVar95;
  auVar14 = vshufps_avx(auVar252,auVar252,0xaa);
  fVar69 = auVar14._0_4_;
  auVar192._0_4_ = fVar69 * auVar17._0_4_;
  fVar93 = auVar14._4_4_;
  auVar192._4_4_ = fVar93 * auVar17._4_4_;
  auVar192._8_4_ = fVar69 * auVar17._8_4_;
  auVar192._12_4_ = fVar93 * auVar17._12_4_;
  auVar192._16_4_ = fVar69 * auVar17._16_4_;
  auVar192._20_4_ = fVar93 * auVar17._20_4_;
  auVar192._24_4_ = fVar69 * auVar17._24_4_;
  auVar192._28_4_ = 0;
  auVar24._4_4_ = auVar20._4_4_ * fVar93;
  auVar24._0_4_ = auVar20._0_4_ * fVar69;
  auVar24._8_4_ = auVar20._8_4_ * fVar69;
  auVar24._12_4_ = auVar20._12_4_ * fVar93;
  auVar24._16_4_ = auVar20._16_4_ * fVar69;
  auVar24._20_4_ = auVar20._20_4_ * fVar93;
  auVar24._24_4_ = auVar20._24_4_ * fVar69;
  auVar24._28_4_ = auVar17._28_4_;
  auVar17._4_4_ = auVar260._4_4_ * fVar93;
  auVar17._0_4_ = auVar260._0_4_ * fVar69;
  auVar17._8_4_ = auVar260._8_4_ * fVar69;
  auVar17._12_4_ = auVar260._12_4_ * fVar93;
  auVar17._16_4_ = auVar260._16_4_ * fVar69;
  auVar17._20_4_ = auVar260._20_4_ * fVar93;
  auVar17._24_4_ = auVar260._24_4_ * fVar69;
  auVar17._28_4_ = fVar93;
  auVar14 = vfmadd231ps_fma(auVar192,auVar286,auVar16);
  auVar4 = vfmadd231ps_fma(auVar24,auVar286,auVar19);
  auVar5 = vfmadd231ps_fma(auVar17,auVar286,auVar22);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar278,auVar87);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar278,auVar18);
  auVar123._8_4_ = 0x7fffffff;
  auVar123._0_8_ = 0x7fffffff7fffffff;
  auVar123._12_4_ = 0x7fffffff;
  auVar123._16_4_ = 0x7fffffff;
  auVar123._20_4_ = 0x7fffffff;
  auVar123._24_4_ = 0x7fffffff;
  auVar123._28_4_ = 0x7fffffff;
  auVar146._8_4_ = 0x219392ef;
  auVar146._0_8_ = 0x219392ef219392ef;
  auVar146._12_4_ = 0x219392ef;
  auVar146._16_4_ = 0x219392ef;
  auVar146._20_4_ = 0x219392ef;
  auVar146._24_4_ = 0x219392ef;
  auVar146._28_4_ = 0x219392ef;
  auVar87 = vandps_avx(ZEXT1632(auVar3),auVar123);
  auVar87 = vcmpps_avx(auVar87,auVar146,1);
  auVar16 = vblendvps_avx(ZEXT1632(auVar3),auVar146,auVar87);
  auVar87 = vandps_avx(ZEXT1632(auVar15),auVar123);
  auVar87 = vcmpps_avx(auVar87,auVar146,1);
  auVar17 = vblendvps_avx(ZEXT1632(auVar15),auVar146,auVar87);
  auVar87 = vandps_avx(ZEXT1632(auVar132),auVar123);
  auVar87 = vcmpps_avx(auVar87,auVar146,1);
  auVar87 = vblendvps_avx(ZEXT1632(auVar132),auVar146,auVar87);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar278,auVar21);
  auVar18 = vrcpps_avx(auVar16);
  auVar161._8_4_ = 0x3f800000;
  auVar161._0_8_ = 0x3f8000003f800000;
  auVar161._12_4_ = 0x3f800000;
  auVar161._16_4_ = 0x3f800000;
  auVar161._20_4_ = 0x3f800000;
  auVar161._24_4_ = 0x3f800000;
  auVar161._28_4_ = 0x3f800000;
  auVar14 = vfnmadd213ps_fma(auVar16,auVar18,auVar161);
  auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar18,auVar18);
  auVar16 = vrcpps_avx(auVar17);
  auVar15 = vfnmadd213ps_fma(auVar17,auVar16,auVar161);
  auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar87);
  auVar132 = vfnmadd213ps_fma(auVar87,auVar16,auVar161);
  auVar132 = vfmadd132ps_fma(ZEXT1632(auVar132),auVar16,auVar16);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 * 7 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar6));
  auVar18._4_4_ = auVar14._4_4_ * auVar87._4_4_;
  auVar18._0_4_ = auVar14._0_4_ * auVar87._0_4_;
  auVar18._8_4_ = auVar14._8_4_ * auVar87._8_4_;
  auVar18._12_4_ = auVar14._12_4_ * auVar87._12_4_;
  auVar18._16_4_ = auVar87._16_4_ * 0.0;
  auVar18._20_4_ = auVar87._20_4_ * 0.0;
  auVar18._24_4_ = auVar87._24_4_ * 0.0;
  auVar18._28_4_ = auVar87._28_4_;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 * 9 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar6));
  auVar19._4_4_ = auVar14._4_4_ * auVar87._4_4_;
  auVar19._0_4_ = auVar14._0_4_ * auVar87._0_4_;
  auVar19._8_4_ = auVar14._8_4_ * auVar87._8_4_;
  auVar19._12_4_ = auVar14._12_4_ * auVar87._12_4_;
  auVar19._16_4_ = auVar87._16_4_ * 0.0;
  auVar19._20_4_ = auVar87._20_4_ * 0.0;
  auVar19._24_4_ = auVar87._24_4_ * 0.0;
  auVar19._28_4_ = auVar87._28_4_;
  auVar108._1_3_ = 0;
  auVar108[0] = PVar8;
  auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar8 * 0x10 + uVar67 * -2 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar4));
  auVar20._4_4_ = auVar87._4_4_ * auVar15._4_4_;
  auVar20._0_4_ = auVar87._0_4_ * auVar15._0_4_;
  auVar20._8_4_ = auVar87._8_4_ * auVar15._8_4_;
  auVar20._12_4_ = auVar87._12_4_ * auVar15._12_4_;
  auVar20._16_4_ = auVar87._16_4_ * 0.0;
  auVar20._20_4_ = auVar87._20_4_ * 0.0;
  auVar20._24_4_ = auVar87._24_4_ * 0.0;
  auVar20._28_4_ = auVar87._28_4_;
  auVar87 = vcvtdq2ps_avx(auVar16);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar4));
  auVar21._4_4_ = auVar15._4_4_ * auVar87._4_4_;
  auVar21._0_4_ = auVar15._0_4_ * auVar87._0_4_;
  auVar21._8_4_ = auVar15._8_4_ * auVar87._8_4_;
  auVar21._12_4_ = auVar15._12_4_ * auVar87._12_4_;
  auVar21._16_4_ = auVar87._16_4_ * 0.0;
  auVar21._20_4_ = auVar87._20_4_ * 0.0;
  auVar21._24_4_ = auVar87._24_4_ * 0.0;
  auVar21._28_4_ = auVar87._28_4_;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar61 + uVar67 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar3));
  auVar22._4_4_ = auVar87._4_4_ * auVar132._4_4_;
  auVar22._0_4_ = auVar87._0_4_ * auVar132._0_4_;
  auVar22._8_4_ = auVar87._8_4_ * auVar132._8_4_;
  auVar22._12_4_ = auVar87._12_4_ * auVar132._12_4_;
  auVar22._16_4_ = auVar87._16_4_ * 0.0;
  auVar22._20_4_ = auVar87._20_4_ * 0.0;
  auVar22._24_4_ = auVar87._24_4_ * 0.0;
  auVar22._28_4_ = auVar87._28_4_;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 * 0x17 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar3));
  auVar260._4_4_ = auVar132._4_4_ * auVar87._4_4_;
  auVar260._0_4_ = auVar132._0_4_ * auVar87._0_4_;
  auVar260._8_4_ = auVar132._8_4_ * auVar87._8_4_;
  auVar260._12_4_ = auVar132._12_4_ * auVar87._12_4_;
  auVar260._16_4_ = auVar87._16_4_ * 0.0;
  auVar260._20_4_ = auVar87._20_4_ * 0.0;
  auVar260._24_4_ = auVar87._24_4_ * 0.0;
  auVar260._28_4_ = auVar87._28_4_;
  auVar87 = vpminsd_avx2(auVar18,auVar19);
  auVar16 = vpminsd_avx2(auVar20,auVar21);
  auVar87 = vmaxps_avx(auVar87,auVar16);
  uVar70 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar193._4_4_ = uVar70;
  auVar193._0_4_ = uVar70;
  auVar193._8_4_ = uVar70;
  auVar193._12_4_ = uVar70;
  auVar193._16_4_ = uVar70;
  auVar193._20_4_ = uVar70;
  auVar193._24_4_ = uVar70;
  auVar193._28_4_ = uVar70;
  auVar16 = vpminsd_avx2(auVar22,auVar260);
  auVar16 = vmaxps_avx(auVar16,auVar193);
  auVar87 = vmaxps_avx(auVar87,auVar16);
  local_300._4_4_ = auVar87._4_4_ * 0.99999964;
  local_300._0_4_ = auVar87._0_4_ * 0.99999964;
  local_300._8_4_ = auVar87._8_4_ * 0.99999964;
  local_300._12_4_ = auVar87._12_4_ * 0.99999964;
  local_300._16_4_ = auVar87._16_4_ * 0.99999964;
  local_300._20_4_ = auVar87._20_4_ * 0.99999964;
  local_300._24_4_ = auVar87._24_4_ * 0.99999964;
  local_300._28_4_ = auVar16._28_4_;
  auVar87 = vpmaxsd_avx2(auVar18,auVar19);
  auVar16 = vpmaxsd_avx2(auVar20,auVar21);
  auVar87 = vminps_avx(auVar87,auVar16);
  auVar16 = vpmaxsd_avx2(auVar22,auVar260);
  uVar70 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar124._4_4_ = uVar70;
  auVar124._0_4_ = uVar70;
  auVar124._8_4_ = uVar70;
  auVar124._12_4_ = uVar70;
  auVar124._16_4_ = uVar70;
  auVar124._20_4_ = uVar70;
  auVar124._24_4_ = uVar70;
  auVar124._28_4_ = uVar70;
  auVar16 = vminps_avx(auVar16,auVar124);
  auVar87 = vminps_avx(auVar87,auVar16);
  auVar25._4_4_ = auVar87._4_4_ * 1.0000004;
  auVar25._0_4_ = auVar87._0_4_ * 1.0000004;
  auVar25._8_4_ = auVar87._8_4_ * 1.0000004;
  auVar25._12_4_ = auVar87._12_4_ * 1.0000004;
  auVar25._16_4_ = auVar87._16_4_ * 1.0000004;
  auVar25._20_4_ = auVar87._20_4_ * 1.0000004;
  auVar25._24_4_ = auVar87._24_4_ * 1.0000004;
  auVar25._28_4_ = auVar87._28_4_;
  auVar108[4] = PVar8;
  auVar108._5_3_ = 0;
  auVar108[8] = PVar8;
  auVar108._9_3_ = 0;
  auVar108[0xc] = PVar8;
  auVar108._13_3_ = 0;
  auVar108[0x10] = PVar8;
  auVar108._17_3_ = 0;
  auVar108[0x14] = PVar8;
  auVar108._21_3_ = 0;
  auVar108[0x18] = PVar8;
  auVar108._25_3_ = 0;
  auVar108[0x1c] = PVar8;
  auVar108._29_3_ = 0;
  auVar16 = vpcmpgtd_avx2(auVar108,_DAT_01fe9900);
  auVar87 = vcmpps_avx(local_300,auVar25,2);
  auVar87 = vandps_avx(auVar87,auVar16);
  uVar59 = vmovmskps_avx(auVar87);
  if (uVar59 == 0) {
    return;
  }
  uVar59 = uVar59 & 0xff;
  auVar87._16_16_ = mm_lookupmask_ps._240_16_;
  auVar87._0_16_ = mm_lookupmask_ps._240_16_;
  local_2e0 = vblendps_avx(auVar87,ZEXT832(0) << 0x20,0x80);
  iVar60 = 1 << ((uint)k & 0x1f);
  auVar88._4_4_ = iVar60;
  auVar88._0_4_ = iVar60;
  auVar88._8_4_ = iVar60;
  auVar88._12_4_ = iVar60;
  auVar88._16_4_ = iVar60;
  auVar88._20_4_ = iVar60;
  auVar88._24_4_ = iVar60;
  auVar88._28_4_ = iVar60;
  auVar16 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar87 = vpand_avx2(auVar88,auVar16);
  local_360 = vpcmpeqd_avx2(auVar87,auVar16);
  local_510 = 0x7fffffff;
  uStack_50c = 0x7fffffff;
  uStack_508 = 0x7fffffff;
  uStack_504 = 0x7fffffff;
  do {
    lVar62 = 0;
    uVar67 = (ulong)uVar59;
    for (uVar61 = uVar67; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
      lVar62 = lVar62 + 1;
    }
    uVar59 = *(uint *)(prim + 2);
    uVar9 = *(uint *)(prim + lVar62 * 4 + 6);
    pGVar10 = (context->scene->geometries).items[uVar59].ptr;
    uVar61 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                             pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)uVar9);
    p_Var11 = pGVar10[1].intersectionFilterN;
    pvVar12 = pGVar10[2].userPtr;
    _Var13 = pGVar10[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar5 = *(undefined1 (*) [16])(_Var13 + uVar61 * (long)pvVar12);
    auVar14 = *(undefined1 (*) [16])(_Var13 + (uVar61 + 1) * (long)pvVar12);
    auVar15 = *(undefined1 (*) [16])(_Var13 + (uVar61 + 2) * (long)pvVar12);
    pfVar1 = (float *)(_Var13 + (long)pvVar12 * (uVar61 + 3));
    fVar69 = *pfVar1;
    fVar93 = pfVar1[1];
    fVar113 = pfVar1[2];
    fVar203 = pfVar1[3];
    lVar62 = *(long *)&pGVar10[1].time_range.upper;
    auVar132 = *(undefined1 (*) [16])(lVar62 + (long)p_Var11 * uVar61);
    auVar3 = *(undefined1 (*) [16])(lVar62 + (long)p_Var11 * (uVar61 + 1));
    auVar4 = *(undefined1 (*) [16])(lVar62 + (long)p_Var11 * (uVar61 + 2));
    uVar67 = uVar67 - 1 & uVar67;
    pfVar1 = (float *)(lVar62 + (long)p_Var11 * (uVar61 + 3));
    fVar163 = *pfVar1;
    fVar182 = pfVar1[1];
    fVar183 = pfVar1[2];
    fVar184 = pfVar1[3];
    if (uVar67 != 0) {
      uVar66 = uVar67 - 1 & uVar67;
      for (uVar61 = uVar67; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
      }
      if (uVar66 != 0) {
        for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar96._0_4_ = fVar163 * 0.0;
    auVar96._4_4_ = fVar182 * 0.0;
    auVar96._8_4_ = fVar183 * 0.0;
    auVar96._12_4_ = fVar184 * 0.0;
    auVar273._8_4_ = 0x3e2aaaab;
    auVar273._0_8_ = 0x3e2aaaab3e2aaaab;
    auVar273._12_4_ = 0x3e2aaaab;
    auVar217 = vfmadd213ps_fma(auVar273,auVar4,auVar96);
    auVar204._8_4_ = 0x3f2aaaab;
    auVar204._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar204._12_4_ = 0x3f2aaaab;
    auVar217 = vfmadd231ps_fma(auVar217,auVar3,auVar204);
    auVar7 = vfmadd231ps_fma(auVar217,auVar132,auVar273);
    auVar73._8_4_ = 0x3f000000;
    auVar73._0_8_ = 0x3f0000003f000000;
    auVar73._12_4_ = 0x3f000000;
    auVar217 = vfmadd231ps_fma(auVar96,auVar4,auVar73);
    auVar217 = vfnmadd231ps_fma(auVar217,auVar3,ZEXT816(0) << 0x40);
    auVar154 = vfnmadd231ps_fma(auVar217,auVar132,auVar73);
    auVar249._0_4_ = fVar69 * 0.0;
    auVar249._4_4_ = fVar93 * 0.0;
    auVar249._8_4_ = fVar113 * 0.0;
    auVar249._12_4_ = fVar203 * 0.0;
    auVar217 = vfmadd213ps_fma(auVar273,auVar15,auVar249);
    auVar217 = vfmadd231ps_fma(auVar217,auVar14,auVar204);
    auVar217 = vfmadd231ps_fma(auVar217,auVar5,auVar273);
    auVar252 = vfmadd231ps_fma(auVar249,auVar15,auVar73);
    auVar252 = vfnmadd231ps_fma(auVar252,auVar14,(undefined1  [16])0x0);
    auVar75 = vfnmadd231ps_fma(auVar252,auVar5,auVar73);
    auVar126._0_4_ = fVar163 * 0.16666667;
    auVar126._4_4_ = fVar182 * 0.16666667;
    auVar126._8_4_ = fVar183 * 0.16666667;
    auVar126._12_4_ = fVar184 * 0.16666667;
    auVar252 = vfmadd231ps_fma(auVar126,auVar4,auVar204);
    auVar252 = vfmadd231ps_fma(auVar252,auVar3,auVar273);
    auVar252 = vfmadd231ps_fma(auVar252,auVar132,(undefined1  [16])0x0);
    auVar140._0_4_ = fVar163 * 0.5;
    auVar140._4_4_ = fVar182 * 0.5;
    auVar140._8_4_ = fVar183 * 0.5;
    auVar140._12_4_ = fVar184 * 0.5;
    auVar4 = vfmadd231ps_fma(auVar140,(undefined1  [16])0x0,auVar4);
    auVar3 = vfnmadd231ps_fma(auVar4,auVar73,auVar3);
    auVar23 = vfnmadd231ps_fma(auVar3,(undefined1  [16])0x0,auVar132);
    auVar216._0_4_ = fVar69 * 0.16666667;
    auVar216._4_4_ = fVar93 * 0.16666667;
    auVar216._8_4_ = fVar113 * 0.16666667;
    auVar216._12_4_ = fVar203 * 0.16666667;
    auVar114._8_4_ = 0x3f2aaaab;
    auVar114._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar114._12_4_ = 0x3f2aaaab;
    auVar132 = vfmadd231ps_fma(auVar216,auVar15,auVar114);
    auVar132 = vfmadd231ps_fma(auVar132,auVar14,auVar273);
    auVar4 = vfmadd231ps_fma(auVar132,auVar5,(undefined1  [16])0x0);
    auVar233._0_4_ = fVar69 * 0.5;
    auVar233._4_4_ = fVar93 * 0.5;
    auVar233._8_4_ = fVar113 * 0.5;
    auVar233._12_4_ = fVar203 * 0.5;
    auVar15 = vfmadd231ps_fma(auVar233,(undefined1  [16])0x0,auVar15);
    auVar14 = vfnmadd231ps_fma(auVar15,auVar73,auVar14);
    auVar5 = vfnmadd231ps_fma(auVar14,(undefined1  [16])0x0,auVar5);
    auVar14 = vshufps_avx(auVar154,auVar154,0xc9);
    auVar15 = vshufps_avx(auVar217,auVar217,0xc9);
    fVar125 = auVar154._0_4_;
    auVar165._0_4_ = fVar125 * auVar15._0_4_;
    fVar94 = auVar154._4_4_;
    auVar165._4_4_ = fVar94 * auVar15._4_4_;
    fVar72 = auVar154._8_4_;
    auVar165._8_4_ = fVar72 * auVar15._8_4_;
    fVar164 = auVar154._12_4_;
    auVar165._12_4_ = fVar164 * auVar15._12_4_;
    auVar15 = vfmsub231ps_fma(auVar165,auVar14,auVar217);
    auVar132 = vshufps_avx(auVar15,auVar15,0xc9);
    auVar15 = vshufps_avx(auVar75,auVar75,0xc9);
    auVar166._0_4_ = fVar125 * auVar15._0_4_;
    auVar166._4_4_ = fVar94 * auVar15._4_4_;
    auVar166._8_4_ = fVar72 * auVar15._8_4_;
    auVar166._12_4_ = fVar164 * auVar15._12_4_;
    auVar14 = vfmsub231ps_fma(auVar166,auVar14,auVar75);
    auVar3 = vshufps_avx(auVar14,auVar14,0xc9);
    auVar14 = vshufps_avx(auVar23,auVar23,0xc9);
    auVar15 = vshufps_avx(auVar4,auVar4,0xc9);
    fVar71 = auVar23._0_4_;
    auVar149._0_4_ = fVar71 * auVar15._0_4_;
    fVar232 = auVar23._4_4_;
    auVar149._4_4_ = fVar232 * auVar15._4_4_;
    fVar139 = auVar23._8_4_;
    auVar149._8_4_ = fVar139 * auVar15._8_4_;
    fVar148 = auVar23._12_4_;
    auVar149._12_4_ = fVar148 * auVar15._12_4_;
    auVar15 = vfmsub231ps_fma(auVar149,auVar14,auVar4);
    auVar4 = vshufps_avx(auVar15,auVar15,0xc9);
    auVar15 = vshufps_avx(auVar5,auVar5,0xc9);
    auVar185._0_4_ = fVar71 * auVar15._0_4_;
    auVar185._4_4_ = fVar232 * auVar15._4_4_;
    auVar185._8_4_ = fVar139 * auVar15._8_4_;
    auVar185._12_4_ = fVar148 * auVar15._12_4_;
    auVar15 = vfmsub231ps_fma(auVar185,auVar14,auVar5);
    auVar14 = vdpps_avx(auVar132,auVar132,0x7f);
    auVar5 = vshufps_avx(auVar15,auVar15,0xc9);
    fVar93 = auVar14._0_4_;
    auVar217 = ZEXT416((uint)fVar93);
    auVar15 = vrsqrtss_avx(auVar217,auVar217);
    fVar69 = auVar15._0_4_;
    auVar15 = vdpps_avx(auVar132,auVar3,0x7f);
    fVar69 = fVar69 * 1.5 + fVar93 * -0.5 * fVar69 * fVar69 * fVar69;
    fVar163 = auVar132._0_4_ * fVar69;
    fVar182 = auVar132._4_4_ * fVar69;
    fVar183 = auVar132._8_4_ * fVar69;
    fVar184 = auVar132._12_4_ * fVar69;
    auVar243._0_4_ = auVar3._0_4_ * fVar93;
    auVar243._4_4_ = auVar3._4_4_ * fVar93;
    auVar243._8_4_ = auVar3._8_4_ * fVar93;
    auVar243._12_4_ = auVar3._12_4_ * fVar93;
    fVar93 = auVar15._0_4_;
    auVar205._0_4_ = auVar132._0_4_ * fVar93;
    auVar205._4_4_ = auVar132._4_4_ * fVar93;
    auVar205._8_4_ = auVar132._8_4_ * fVar93;
    auVar205._12_4_ = auVar132._12_4_ * fVar93;
    auVar132 = vsubps_avx(auVar243,auVar205);
    auVar15 = vrcpss_avx(auVar217,auVar217);
    auVar14 = vfnmadd213ss_fma(auVar14,auVar15,SUB6416(ZEXT464(0x40000000),0));
    fVar113 = auVar15._0_4_ * auVar14._0_4_;
    auVar14 = vdpps_avx(auVar4,auVar4,0x7f);
    fVar203 = auVar14._0_4_;
    auVar217 = ZEXT416((uint)fVar203);
    auVar15 = vrsqrtss_avx(auVar217,auVar217);
    fVar93 = auVar15._0_4_;
    fVar93 = fVar93 * 1.5 + fVar203 * -0.5 * fVar93 * fVar93 * fVar93;
    fVar248 = fVar93 * auVar4._0_4_;
    fVar262 = fVar93 * auVar4._4_4_;
    fVar263 = fVar93 * auVar4._8_4_;
    fVar264 = fVar93 * auVar4._12_4_;
    auVar15 = vdpps_avx(auVar4,auVar5,0x7f);
    auVar186._0_4_ = fVar203 * auVar5._0_4_;
    auVar186._4_4_ = fVar203 * auVar5._4_4_;
    auVar186._8_4_ = fVar203 * auVar5._8_4_;
    auVar186._12_4_ = fVar203 * auVar5._12_4_;
    fVar203 = auVar15._0_4_;
    auVar150._0_4_ = fVar203 * auVar4._0_4_;
    auVar150._4_4_ = fVar203 * auVar4._4_4_;
    auVar150._8_4_ = fVar203 * auVar4._8_4_;
    auVar150._12_4_ = fVar203 * auVar4._12_4_;
    auVar3 = vsubps_avx(auVar186,auVar150);
    auVar15 = vrcpss_avx(auVar217,auVar217);
    auVar14 = vfnmadd213ss_fma(auVar14,auVar15,SUB6416(ZEXT464(0x40000000),0));
    fVar203 = auVar14._0_4_ * auVar15._0_4_;
    auVar14 = vshufps_avx(auVar7,auVar7,0xff);
    auVar218._0_4_ = auVar14._0_4_ * fVar163;
    auVar218._4_4_ = auVar14._4_4_ * fVar182;
    auVar218._8_4_ = auVar14._8_4_ * fVar183;
    auVar218._12_4_ = auVar14._12_4_ * fVar184;
    local_540 = vsubps_avx(auVar7,auVar218);
    auVar15 = vshufps_avx(auVar154,auVar154,0xff);
    auVar167._0_4_ = auVar15._0_4_ * fVar163 + fVar69 * auVar132._0_4_ * fVar113 * auVar14._0_4_;
    auVar167._4_4_ = auVar15._4_4_ * fVar182 + fVar69 * auVar132._4_4_ * fVar113 * auVar14._4_4_;
    auVar167._8_4_ = auVar15._8_4_ * fVar183 + fVar69 * auVar132._8_4_ * fVar113 * auVar14._8_4_;
    auVar167._12_4_ = auVar15._12_4_ * fVar184 + fVar69 * auVar132._12_4_ * fVar113 * auVar14._12_4_
    ;
    auVar132 = vsubps_avx(auVar154,auVar167);
    local_550._0_4_ = auVar7._0_4_ + auVar218._0_4_;
    local_550._4_4_ = auVar7._4_4_ + auVar218._4_4_;
    fStack_548 = auVar7._8_4_ + auVar218._8_4_;
    fStack_544 = auVar7._12_4_ + auVar218._12_4_;
    auVar14 = vshufps_avx(auVar252,auVar252,0xff);
    auVar115._0_4_ = fVar248 * auVar14._0_4_;
    auVar115._4_4_ = fVar262 * auVar14._4_4_;
    auVar115._8_4_ = fVar263 * auVar14._8_4_;
    auVar115._12_4_ = fVar264 * auVar14._12_4_;
    local_560 = vsubps_avx(auVar252,auVar115);
    auVar15 = vshufps_avx(auVar23,auVar23,0xff);
    auVar128._0_4_ = fVar248 * auVar15._0_4_ + auVar14._0_4_ * fVar93 * auVar3._0_4_ * fVar203;
    auVar128._4_4_ = fVar262 * auVar15._4_4_ + auVar14._4_4_ * fVar93 * auVar3._4_4_ * fVar203;
    auVar128._8_4_ = fVar263 * auVar15._8_4_ + auVar14._8_4_ * fVar93 * auVar3._8_4_ * fVar203;
    auVar128._12_4_ = fVar264 * auVar15._12_4_ + auVar14._12_4_ * fVar93 * auVar3._12_4_ * fVar203;
    auVar14 = vsubps_avx(auVar23,auVar128);
    fVar163 = auVar252._0_4_ + auVar115._0_4_;
    fVar182 = auVar252._4_4_ + auVar115._4_4_;
    fVar183 = auVar252._8_4_ + auVar115._8_4_;
    fVar184 = auVar252._12_4_ + auVar115._12_4_;
    local_570._0_4_ = local_540._0_4_ + auVar132._0_4_ * 0.33333334;
    local_570._4_4_ = local_540._4_4_ + auVar132._4_4_ * 0.33333334;
    local_570._8_4_ = local_540._8_4_ + auVar132._8_4_ * 0.33333334;
    local_570._12_4_ = local_540._12_4_ + auVar132._12_4_ * 0.33333334;
    auVar97._0_4_ = auVar14._0_4_ * 0.33333334;
    auVar97._4_4_ = auVar14._4_4_ * 0.33333334;
    auVar97._8_4_ = auVar14._8_4_ * 0.33333334;
    auVar97._12_4_ = auVar14._12_4_ * 0.33333334;
    local_580 = vsubps_avx(local_560,auVar97);
    local_520 = vsubps_avx(local_540,auVar6);
    auVar14 = vshufps_avx(local_520,local_520,0x55);
    auVar15 = vshufps_avx(local_520,local_520,0xaa);
    aVar2 = pre->ray_space[k].vy.field_0;
    fVar69 = pre->ray_space[k].vz.field_0.m128[0];
    fVar93 = pre->ray_space[k].vz.field_0.m128[1];
    fVar113 = pre->ray_space[k].vz.field_0.m128[2];
    fVar203 = pre->ray_space[k].vz.field_0.m128[3];
    auVar98._0_4_ = fVar69 * auVar15._0_4_;
    auVar98._4_4_ = fVar93 * auVar15._4_4_;
    auVar98._8_4_ = fVar113 * auVar15._8_4_;
    auVar98._12_4_ = fVar203 * auVar15._12_4_;
    auVar132 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar2,auVar14);
    local_530 = vsubps_avx(local_570,auVar6);
    auVar14 = vshufps_avx(local_530,local_530,0x55);
    auVar15 = vshufps_avx(local_530,local_530,0xaa);
    auVar281._0_4_ = fVar69 * auVar15._0_4_;
    auVar281._4_4_ = fVar93 * auVar15._4_4_;
    auVar281._8_4_ = fVar113 * auVar15._8_4_;
    auVar281._12_4_ = fVar203 * auVar15._12_4_;
    auVar15 = vfmadd231ps_fma(auVar281,(undefined1  [16])aVar2,auVar14);
    local_3f0 = vsubps_avx(local_580,auVar6);
    auVar14 = vshufps_avx(local_3f0,local_3f0,0xaa);
    auVar250._0_4_ = fVar69 * auVar14._0_4_;
    auVar250._4_4_ = fVar93 * auVar14._4_4_;
    auVar250._8_4_ = fVar113 * auVar14._8_4_;
    auVar250._12_4_ = fVar203 * auVar14._12_4_;
    auVar14 = vshufps_avx(local_3f0,local_3f0,0x55);
    auVar3 = vfmadd231ps_fma(auVar250,(undefined1  [16])aVar2,auVar14);
    local_400 = vsubps_avx(local_560,auVar6);
    auVar14 = vshufps_avx(local_400,local_400,0xaa);
    auVar265._0_4_ = fVar69 * auVar14._0_4_;
    auVar265._4_4_ = fVar93 * auVar14._4_4_;
    auVar265._8_4_ = fVar113 * auVar14._8_4_;
    auVar265._12_4_ = fVar203 * auVar14._12_4_;
    auVar14 = vshufps_avx(local_400,local_400,0x55);
    auVar4 = vfmadd231ps_fma(auVar265,(undefined1  [16])aVar2,auVar14);
    local_410 = vsubps_avx(_local_550,auVar6);
    auVar14 = vshufps_avx(local_410,local_410,0xaa);
    auVar151._0_4_ = fVar69 * auVar14._0_4_;
    auVar151._4_4_ = fVar93 * auVar14._4_4_;
    auVar151._8_4_ = fVar113 * auVar14._8_4_;
    auVar151._12_4_ = fVar203 * auVar14._12_4_;
    auVar14 = vshufps_avx(local_410,local_410,0x55);
    auVar5 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar2,auVar14);
    local_590._0_4_ = (fVar125 + auVar167._0_4_) * 0.33333334 + (float)local_550._0_4_;
    local_590._4_4_ = (fVar94 + auVar167._4_4_) * 0.33333334 + (float)local_550._4_4_;
    fStack_588 = (fVar72 + auVar167._8_4_) * 0.33333334 + fStack_548;
    fStack_584 = (fVar164 + auVar167._12_4_) * 0.33333334 + fStack_544;
    local_420 = vsubps_avx(_local_590,auVar6);
    auVar14 = vshufps_avx(local_420,local_420,0xaa);
    auVar206._0_4_ = auVar14._0_4_ * fVar69;
    auVar206._4_4_ = auVar14._4_4_ * fVar93;
    auVar206._8_4_ = auVar14._8_4_ * fVar113;
    auVar206._12_4_ = auVar14._12_4_ * fVar203;
    auVar14 = vshufps_avx(local_420,local_420,0x55);
    auVar217 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar2,auVar14);
    auVar219._0_4_ = (fVar71 + auVar128._0_4_) * 0.33333334;
    auVar219._4_4_ = (fVar232 + auVar128._4_4_) * 0.33333334;
    auVar219._8_4_ = (fVar139 + auVar128._8_4_) * 0.33333334;
    auVar219._12_4_ = (fVar148 + auVar128._12_4_) * 0.33333334;
    auVar23._4_4_ = fVar182;
    auVar23._0_4_ = fVar163;
    auVar23._8_4_ = fVar183;
    auVar23._12_4_ = fVar184;
    _local_5a0 = vsubps_avx(auVar23,auVar219);
    local_430 = vsubps_avx(_local_5a0,auVar6);
    auVar14 = vshufps_avx(local_430,local_430,0xaa);
    auVar220._0_4_ = auVar14._0_4_ * fVar69;
    auVar220._4_4_ = auVar14._4_4_ * fVar93;
    auVar220._8_4_ = auVar14._8_4_ * fVar113;
    auVar220._12_4_ = auVar14._12_4_ * fVar203;
    auVar14 = vshufps_avx(local_430,local_430,0x55);
    auVar7 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar2,auVar14);
    local_440 = vsubps_avx(auVar23,auVar6);
    auVar14 = vshufps_avx(local_440,local_440,0xaa);
    auVar74._0_4_ = fVar69 * auVar14._0_4_;
    auVar74._4_4_ = fVar93 * auVar14._4_4_;
    auVar74._8_4_ = fVar113 * auVar14._8_4_;
    auVar74._12_4_ = fVar203 * auVar14._12_4_;
    auVar14 = vshufps_avx(local_440,local_440,0x55);
    auVar14 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar2,auVar14);
    auVar168._4_4_ = local_520._0_4_;
    auVar168._0_4_ = local_520._0_4_;
    auVar168._8_4_ = local_520._0_4_;
    auVar168._12_4_ = local_520._0_4_;
    aVar2 = pre->ray_space[k].vx.field_0;
    auVar6 = vfmadd231ps_fma(auVar132,(undefined1  [16])aVar2,auVar168);
    auVar169._4_4_ = local_530._0_4_;
    auVar169._0_4_ = local_530._0_4_;
    auVar169._8_4_ = local_530._0_4_;
    auVar169._12_4_ = local_530._0_4_;
    auVar252 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar2,auVar169);
    uVar70 = local_3f0._0_4_;
    auVar170._4_4_ = uVar70;
    auVar170._0_4_ = uVar70;
    auVar170._8_4_ = uVar70;
    auVar170._12_4_ = uVar70;
    auVar154 = vfmadd231ps_fma(auVar3,(undefined1  [16])aVar2,auVar170);
    uVar70 = local_400._0_4_;
    auVar171._4_4_ = uVar70;
    auVar171._0_4_ = uVar70;
    auVar171._8_4_ = uVar70;
    auVar171._12_4_ = uVar70;
    auVar75 = vfmadd231ps_fma(auVar4,(undefined1  [16])aVar2,auVar171);
    uVar70 = local_410._0_4_;
    auVar172._4_4_ = uVar70;
    auVar172._0_4_ = uVar70;
    auVar172._8_4_ = uVar70;
    auVar172._12_4_ = uVar70;
    auVar23 = vfmadd231ps_fma(auVar5,(undefined1  [16])aVar2,auVar172);
    uVar70 = local_420._0_4_;
    auVar173._4_4_ = uVar70;
    auVar173._0_4_ = uVar70;
    auVar173._8_4_ = uVar70;
    auVar173._12_4_ = uVar70;
    auVar217 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar2,auVar173);
    uVar70 = local_430._0_4_;
    auVar174._4_4_ = uVar70;
    auVar174._0_4_ = uVar70;
    auVar174._8_4_ = uVar70;
    auVar174._12_4_ = uVar70;
    auVar7 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar2,auVar174);
    uVar70 = local_440._0_4_;
    auVar175._4_4_ = uVar70;
    auVar175._0_4_ = uVar70;
    auVar175._8_4_ = uVar70;
    auVar175._12_4_ = uVar70;
    auVar73 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar2,auVar175);
    local_500 = vmovlhps_avx(auVar6,auVar23);
    auVar3 = vmovlhps_avx(auVar252,auVar217);
    auVar4 = vmovlhps_avx(auVar154,auVar7);
    auVar5 = vmovlhps_avx(auVar75,auVar73);
    auVar14 = vminps_avx(local_500,auVar3);
    auVar15 = vminps_avx(auVar4,auVar5);
    auVar132 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(local_500,auVar3);
    auVar15 = vmaxps_avx(auVar4,auVar5);
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar15 = vshufpd_avx(auVar132,auVar132,3);
    auVar132 = vminps_avx(auVar132,auVar15);
    auVar15 = vshufpd_avx(auVar14,auVar14,3);
    auVar15 = vmaxps_avx(auVar14,auVar15);
    auVar244._4_4_ = uStack_50c;
    auVar244._0_4_ = local_510;
    auVar244._8_4_ = uStack_508;
    auVar244._12_4_ = uStack_504;
    auVar14 = vandps_avx(auVar244,auVar132);
    auVar15 = vandps_avx(auVar244,auVar15);
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar15 = vmovshdup_avx(auVar14);
    auVar14 = vmaxss_avx(auVar15,auVar14);
    local_3a0 = auVar14._0_4_ * 9.536743e-07;
    auVar187._8_8_ = auVar6._0_8_;
    auVar187._0_8_ = auVar6._0_8_;
    auVar234._8_8_ = auVar252._0_8_;
    auVar234._0_8_ = auVar252._0_8_;
    auVar251._0_8_ = auVar154._0_8_;
    auVar251._8_8_ = auVar251._0_8_;
    auVar266._0_8_ = auVar75._0_8_;
    auVar266._8_8_ = auVar266._0_8_;
    local_3b0 = ZEXT416((uint)local_3a0);
    fStack_39c = local_3a0;
    fStack_398 = local_3a0;
    fStack_394 = local_3a0;
    fStack_390 = local_3a0;
    fStack_38c = local_3a0;
    fStack_388 = local_3a0;
    fStack_384 = local_3a0;
    local_1c0 = -local_3a0;
    fStack_1bc = local_1c0;
    fStack_1b8 = local_1c0;
    fStack_1b4 = local_1c0;
    fStack_1b0 = local_1c0;
    fStack_1ac = local_1c0;
    fStack_1a8 = local_1c0;
    fStack_1a4 = local_1c0;
    local_320 = uVar59;
    uStack_31c = uVar59;
    uStack_318 = uVar59;
    uStack_314 = uVar59;
    uStack_310 = uVar59;
    uStack_30c = uVar59;
    uStack_308 = uVar59;
    uStack_304 = uVar59;
    local_340 = uVar9;
    uStack_33c = uVar9;
    uStack_338 = uVar9;
    uStack_334 = uVar9;
    uStack_330 = uVar9;
    uStack_32c = uVar9;
    uStack_328 = uVar9;
    uStack_324 = uVar9;
    uVar68 = 0;
    fVar69 = *(float *)(ray + k * 4 + 0x60);
    local_3c0 = vsubps_avx(auVar3,local_500);
    local_3d0 = vsubps_avx(auVar4,auVar3);
    local_3e0 = vsubps_avx(auVar5,auVar4);
    local_460 = vsubps_avx(_local_550,local_540);
    local_470 = vsubps_avx(_local_590,local_570);
    local_480 = vsubps_avx(_local_5a0,local_580);
    auVar131._4_4_ = fVar182;
    auVar131._0_4_ = fVar163;
    auVar131._8_4_ = fVar183;
    auVar131._12_4_ = fVar184;
    _local_490 = vsubps_avx(auVar131,local_560);
    auVar75 = ZEXT816(0x3f80000000000000);
    local_450 = auVar75;
LAB_017acae1:
    auVar14 = vshufps_avx(auVar75,auVar75,0x50);
    auVar282._8_4_ = 0x3f800000;
    auVar282._0_8_ = 0x3f8000003f800000;
    auVar282._12_4_ = 0x3f800000;
    auVar287._16_4_ = 0x3f800000;
    auVar287._0_16_ = auVar282;
    auVar287._20_4_ = 0x3f800000;
    auVar287._24_4_ = 0x3f800000;
    auVar287._28_4_ = 0x3f800000;
    auVar15 = vsubps_avx(auVar282,auVar14);
    fVar93 = auVar14._0_4_;
    fVar139 = auVar23._0_4_;
    auVar76._0_4_ = fVar139 * fVar93;
    fVar113 = auVar14._4_4_;
    fVar148 = auVar23._4_4_;
    auVar76._4_4_ = fVar148 * fVar113;
    fVar203 = auVar14._8_4_;
    auVar76._8_4_ = fVar139 * fVar203;
    fVar125 = auVar14._12_4_;
    auVar76._12_4_ = fVar148 * fVar125;
    fVar248 = auVar217._0_4_;
    auVar176._0_4_ = fVar248 * fVar93;
    fVar262 = auVar217._4_4_;
    auVar176._4_4_ = fVar262 * fVar113;
    auVar176._8_4_ = fVar248 * fVar203;
    auVar176._12_4_ = fVar262 * fVar125;
    fVar202 = auVar7._0_4_;
    auVar141._0_4_ = fVar202 * fVar93;
    fVar214 = auVar7._4_4_;
    auVar141._4_4_ = fVar214 * fVar113;
    auVar141._8_4_ = fVar202 * fVar203;
    auVar141._12_4_ = fVar214 * fVar125;
    fVar215 = auVar73._0_4_;
    auVar116._0_4_ = fVar215 * fVar93;
    fVar231 = auVar73._4_4_;
    auVar116._4_4_ = fVar231 * fVar113;
    auVar116._8_4_ = fVar215 * fVar203;
    auVar116._12_4_ = fVar231 * fVar125;
    auVar252 = vfmadd231ps_fma(auVar76,auVar15,auVar187);
    auVar154 = vfmadd231ps_fma(auVar176,auVar15,auVar234);
    auVar131 = vfmadd231ps_fma(auVar141,auVar15,auVar251);
    auVar244 = vfmadd231ps_fma(auVar116,auVar266,auVar15);
    auVar14 = vmovshdup_avx(local_450);
    fVar93 = local_450._0_4_;
    fStack_268 = (auVar14._0_4_ - fVar93) * 0.04761905;
    auVar229._4_4_ = fVar93;
    auVar229._0_4_ = fVar93;
    auVar229._8_4_ = fVar93;
    auVar229._12_4_ = fVar93;
    auVar229._16_4_ = fVar93;
    auVar229._20_4_ = fVar93;
    auVar229._24_4_ = fVar93;
    auVar229._28_4_ = fVar93;
    auVar109._0_8_ = auVar14._0_8_;
    auVar109._8_8_ = auVar109._0_8_;
    auVar109._16_8_ = auVar109._0_8_;
    auVar109._24_8_ = auVar109._0_8_;
    auVar87 = vsubps_avx(auVar109,auVar229);
    uVar70 = auVar252._0_4_;
    auVar279._4_4_ = uVar70;
    auVar279._0_4_ = uVar70;
    auVar279._8_4_ = uVar70;
    auVar279._12_4_ = uVar70;
    auVar279._16_4_ = uVar70;
    auVar279._20_4_ = uVar70;
    auVar279._24_4_ = uVar70;
    auVar279._28_4_ = uVar70;
    auVar14 = vmovshdup_avx(auVar252);
    uVar95 = auVar14._0_8_;
    auVar272._8_8_ = uVar95;
    auVar272._0_8_ = uVar95;
    auVar272._16_8_ = uVar95;
    auVar272._24_8_ = uVar95;
    fVar232 = auVar154._0_4_;
    auVar258._4_4_ = fVar232;
    auVar258._0_4_ = fVar232;
    auVar258._8_4_ = fVar232;
    auVar258._12_4_ = fVar232;
    auVar258._16_4_ = fVar232;
    auVar258._20_4_ = fVar232;
    auVar258._24_4_ = fVar232;
    auVar258._28_4_ = fVar232;
    auVar15 = vmovshdup_avx(auVar154);
    auVar110._0_8_ = auVar15._0_8_;
    auVar110._8_8_ = auVar110._0_8_;
    auVar110._16_8_ = auVar110._0_8_;
    auVar110._24_8_ = auVar110._0_8_;
    fVar71 = auVar131._0_4_;
    auVar194._4_4_ = fVar71;
    auVar194._0_4_ = fVar71;
    auVar194._8_4_ = fVar71;
    auVar194._12_4_ = fVar71;
    auVar194._16_4_ = fVar71;
    auVar194._20_4_ = fVar71;
    auVar194._24_4_ = fVar71;
    auVar194._28_4_ = fVar71;
    auVar132 = vmovshdup_avx(auVar131);
    auVar212._0_8_ = auVar132._0_8_;
    auVar212._8_8_ = auVar212._0_8_;
    auVar212._16_8_ = auVar212._0_8_;
    auVar212._24_8_ = auVar212._0_8_;
    fVar164 = auVar244._0_4_;
    auVar6 = vmovshdup_avx(auVar244);
    auVar74 = vfmadd132ps_fma(auVar87,auVar229,_DAT_01faff20);
    auVar87 = vsubps_avx(auVar287,ZEXT1632(auVar74));
    fVar93 = auVar74._0_4_;
    fVar113 = auVar74._4_4_;
    auVar16._4_4_ = fVar232 * fVar113;
    auVar16._0_4_ = fVar232 * fVar93;
    fVar203 = auVar74._8_4_;
    auVar16._8_4_ = fVar232 * fVar203;
    fVar125 = auVar74._12_4_;
    auVar16._12_4_ = fVar232 * fVar125;
    auVar16._16_4_ = fVar232 * 0.0;
    auVar16._20_4_ = fVar232 * 0.0;
    auVar16._24_4_ = fVar232 * 0.0;
    auVar16._28_4_ = 0x3f800000;
    auVar74 = vfmadd231ps_fma(auVar16,auVar87,auVar279);
    fVar94 = auVar15._0_4_;
    fVar72 = auVar15._4_4_;
    auVar26._4_4_ = fVar72 * fVar113;
    auVar26._0_4_ = fVar94 * fVar93;
    auVar26._8_4_ = fVar94 * fVar203;
    auVar26._12_4_ = fVar72 * fVar125;
    auVar26._16_4_ = fVar94 * 0.0;
    auVar26._20_4_ = fVar72 * 0.0;
    auVar26._24_4_ = fVar94 * 0.0;
    auVar26._28_4_ = uVar70;
    auVar96 = vfmadd231ps_fma(auVar26,auVar87,auVar272);
    auVar27._4_4_ = fVar71 * fVar113;
    auVar27._0_4_ = fVar71 * fVar93;
    auVar27._8_4_ = fVar71 * fVar203;
    auVar27._12_4_ = fVar71 * fVar125;
    auVar27._16_4_ = fVar71 * 0.0;
    auVar27._20_4_ = fVar71 * 0.0;
    auVar27._24_4_ = fVar71 * 0.0;
    auVar27._28_4_ = auVar14._4_4_;
    auVar128 = vfmadd231ps_fma(auVar27,auVar87,auVar258);
    fVar94 = auVar132._0_4_;
    fVar72 = auVar132._4_4_;
    auVar28._4_4_ = fVar72 * fVar113;
    auVar28._0_4_ = fVar94 * fVar93;
    auVar28._8_4_ = fVar94 * fVar203;
    auVar28._12_4_ = fVar72 * fVar125;
    auVar28._16_4_ = fVar94 * 0.0;
    auVar28._20_4_ = fVar72 * 0.0;
    auVar28._24_4_ = fVar94 * 0.0;
    auVar28._28_4_ = fVar232;
    auVar97 = vfmadd231ps_fma(auVar28,auVar87,auVar110);
    auVar14 = vshufps_avx(auVar252,auVar252,0xaa);
    local_700._8_8_ = auVar14._0_8_;
    local_700._0_8_ = local_700._8_8_;
    local_700._16_8_ = local_700._8_8_;
    local_700._24_8_ = local_700._8_8_;
    auVar15 = vshufps_avx(auVar252,auVar252,0xff);
    uStack_778 = auVar15._0_8_;
    local_780 = (undefined1  [8])uStack_778;
    uStack_770 = uStack_778;
    uStack_768 = uStack_778;
    auVar29._4_4_ = fVar164 * fVar113;
    auVar29._0_4_ = fVar164 * fVar93;
    auVar29._8_4_ = fVar164 * fVar203;
    auVar29._12_4_ = fVar164 * fVar125;
    auVar29._16_4_ = fVar164 * 0.0;
    auVar29._20_4_ = fVar164 * 0.0;
    auVar29._24_4_ = fVar164 * 0.0;
    auVar29._28_4_ = fVar164;
    auVar252 = vfmadd231ps_fma(auVar29,auVar87,auVar194);
    auVar15 = vshufps_avx(auVar154,auVar154,0xaa);
    auVar195._0_8_ = auVar15._0_8_;
    auVar195._8_8_ = auVar195._0_8_;
    auVar195._16_8_ = auVar195._0_8_;
    auVar195._24_8_ = auVar195._0_8_;
    auVar132 = vshufps_avx(auVar154,auVar154,0xff);
    local_620._8_8_ = auVar132._0_8_;
    local_620._0_8_ = local_620._8_8_;
    local_620._16_8_ = local_620._8_8_;
    local_620._24_8_ = local_620._8_8_;
    fVar94 = auVar6._0_4_;
    fVar72 = auVar6._4_4_;
    auVar30._4_4_ = fVar72 * fVar113;
    auVar30._0_4_ = fVar94 * fVar93;
    auVar30._8_4_ = fVar94 * fVar203;
    auVar30._12_4_ = fVar72 * fVar125;
    auVar30._16_4_ = fVar94 * 0.0;
    auVar30._20_4_ = fVar72 * 0.0;
    auVar30._24_4_ = fVar94 * 0.0;
    auVar30._28_4_ = auVar14._4_4_;
    auVar98 = vfmadd231ps_fma(auVar30,auVar87,auVar212);
    auVar31._28_4_ = fVar72;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(auVar128._12_4_ * fVar125,
                            CONCAT48(auVar128._8_4_ * fVar203,
                                     CONCAT44(auVar128._4_4_ * fVar113,auVar128._0_4_ * fVar93))));
    auVar74 = vfmadd231ps_fma(auVar31,auVar87,ZEXT1632(auVar74));
    fVar94 = auVar132._4_4_;
    auVar32._28_4_ = fVar94;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(auVar97._12_4_ * fVar125,
                            CONCAT48(auVar97._8_4_ * fVar203,
                                     CONCAT44(auVar97._4_4_ * fVar113,auVar97._0_4_ * fVar93))));
    auVar96 = vfmadd231ps_fma(auVar32,auVar87,ZEXT1632(auVar96));
    auVar14 = vshufps_avx(auVar131,auVar131,0xaa);
    uVar95 = auVar14._0_8_;
    auVar181._8_8_ = uVar95;
    auVar181._0_8_ = uVar95;
    auVar181._16_8_ = uVar95;
    auVar181._24_8_ = uVar95;
    auVar6 = vshufps_avx(auVar131,auVar131,0xff);
    uVar95 = auVar6._0_8_;
    auVar288._8_8_ = uVar95;
    auVar288._0_8_ = uVar95;
    auVar288._16_8_ = uVar95;
    auVar288._24_8_ = uVar95;
    auVar131 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar252._12_4_ * fVar125,
                                                  CONCAT48(auVar252._8_4_ * fVar203,
                                                           CONCAT44(auVar252._4_4_ * fVar113,
                                                                    auVar252._0_4_ * fVar93)))),
                               auVar87,ZEXT1632(auVar128));
    auVar252 = vshufps_avx(auVar244,auVar244,0xaa);
    auVar154 = vshufps_avx(auVar244,auVar244,0xff);
    auVar244 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar125 * auVar98._12_4_,
                                                  CONCAT48(fVar203 * auVar98._8_4_,
                                                           CONCAT44(fVar113 * auVar98._4_4_,
                                                                    fVar93 * auVar98._0_4_)))),
                               auVar87,ZEXT1632(auVar97));
    auVar128 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar125 * auVar131._12_4_,
                                                  CONCAT48(fVar203 * auVar131._8_4_,
                                                           CONCAT44(fVar113 * auVar131._4_4_,
                                                                    fVar93 * auVar131._0_4_)))),
                               auVar87,ZEXT1632(auVar74));
    auVar16 = vsubps_avx(ZEXT1632(auVar131),ZEXT1632(auVar74));
    auVar131 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar125 * auVar244._12_4_,
                                                  CONCAT48(fVar203 * auVar244._8_4_,
                                                           CONCAT44(fVar113 * auVar244._4_4_,
                                                                    fVar93 * auVar244._0_4_)))),
                               auVar87,ZEXT1632(auVar96));
    auVar17 = vsubps_avx(ZEXT1632(auVar244),ZEXT1632(auVar96));
    fVar72 = auVar17._28_4_;
    auVar259._0_4_ = fStack_268 * auVar16._0_4_ * 3.0;
    auVar259._4_4_ = fStack_268 * auVar16._4_4_ * 3.0;
    auVar259._8_4_ = fStack_268 * auVar16._8_4_ * 3.0;
    auVar259._12_4_ = fStack_268 * auVar16._12_4_ * 3.0;
    auVar259._16_4_ = fStack_268 * auVar16._16_4_ * 3.0;
    auVar259._20_4_ = fStack_268 * auVar16._20_4_ * 3.0;
    auVar259._24_4_ = fStack_268 * auVar16._24_4_ * 3.0;
    auVar259._28_4_ = 0;
    local_5c0._0_4_ = fStack_268 * auVar17._0_4_ * 3.0;
    local_5c0._4_4_ = fStack_268 * auVar17._4_4_ * 3.0;
    fStack_5b8 = fStack_268 * auVar17._8_4_ * 3.0;
    fStack_5b4 = fStack_268 * auVar17._12_4_ * 3.0;
    fStack_5b0 = fStack_268 * auVar17._16_4_ * 3.0;
    fStack_5ac = fStack_268 * auVar17._20_4_ * 3.0;
    fStack_5a8 = fStack_268 * auVar17._24_4_ * 3.0;
    fStack_5a4 = fVar72;
    fVar164 = auVar15._0_4_;
    fVar71 = auVar15._4_4_;
    auVar33._4_4_ = fVar71 * fVar113;
    auVar33._0_4_ = fVar164 * fVar93;
    auVar33._8_4_ = fVar164 * fVar203;
    auVar33._12_4_ = fVar71 * fVar125;
    auVar33._16_4_ = fVar164 * 0.0;
    auVar33._20_4_ = fVar71 * 0.0;
    auVar33._24_4_ = fVar164 * 0.0;
    auVar33._28_4_ = fVar72;
    auVar15 = vfmadd231ps_fma(auVar33,auVar87,local_700);
    fVar164 = auVar132._0_4_;
    auVar34._4_4_ = fVar94 * fVar113;
    auVar34._0_4_ = fVar164 * fVar93;
    auVar34._8_4_ = fVar164 * fVar203;
    auVar34._12_4_ = fVar94 * fVar125;
    auVar34._16_4_ = fVar164 * 0.0;
    auVar34._20_4_ = fVar94 * 0.0;
    auVar34._24_4_ = fVar164 * 0.0;
    auVar34._28_4_ = 0;
    auVar132 = vfmadd231ps_fma(auVar34,auVar87,_local_780);
    fVar94 = auVar14._0_4_;
    fVar164 = auVar14._4_4_;
    auVar35._4_4_ = fVar164 * fVar113;
    auVar35._0_4_ = fVar94 * fVar93;
    auVar35._8_4_ = fVar94 * fVar203;
    auVar35._12_4_ = fVar164 * fVar125;
    auVar35._16_4_ = fVar94 * 0.0;
    auVar35._20_4_ = fVar164 * 0.0;
    auVar35._24_4_ = fVar94 * 0.0;
    auVar35._28_4_ = auVar16._28_4_;
    auVar14 = vfmadd231ps_fma(auVar35,auVar87,auVar195);
    fVar94 = auVar6._0_4_;
    fVar232 = auVar6._4_4_;
    auVar36._4_4_ = fVar232 * fVar113;
    auVar36._0_4_ = fVar94 * fVar93;
    auVar36._8_4_ = fVar94 * fVar203;
    auVar36._12_4_ = fVar232 * fVar125;
    auVar36._16_4_ = fVar94 * 0.0;
    auVar36._20_4_ = fVar232 * 0.0;
    auVar36._24_4_ = fVar94 * 0.0;
    auVar36._28_4_ = fVar71;
    auVar6 = vfmadd231ps_fma(auVar36,auVar87,local_620);
    auVar20 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar128));
    fVar94 = auVar252._0_4_;
    fVar164 = auVar252._4_4_;
    auVar37._4_4_ = fVar164 * fVar113;
    auVar37._0_4_ = fVar94 * fVar93;
    auVar37._8_4_ = fVar94 * fVar203;
    auVar37._12_4_ = fVar164 * fVar125;
    auVar37._16_4_ = fVar94 * 0.0;
    auVar37._20_4_ = fVar164 * 0.0;
    auVar37._24_4_ = fVar94 * 0.0;
    auVar37._28_4_ = fVar164;
    auVar252 = vfmadd231ps_fma(auVar37,auVar87,auVar181);
    auVar21 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar131));
    fVar94 = auVar154._0_4_;
    fVar164 = auVar154._4_4_;
    auVar38._4_4_ = fVar164 * fVar113;
    auVar38._0_4_ = fVar94 * fVar93;
    auVar38._8_4_ = fVar94 * fVar203;
    auVar38._12_4_ = fVar164 * fVar125;
    auVar38._16_4_ = fVar94 * 0.0;
    auVar38._20_4_ = fVar164 * 0.0;
    auVar38._24_4_ = fVar94 * 0.0;
    auVar38._28_4_ = fVar164;
    auVar154 = vfmadd231ps_fma(auVar38,auVar87,auVar288);
    auVar39._28_4_ = fVar232;
    auVar39._0_28_ =
         ZEXT1628(CONCAT412(auVar14._12_4_ * fVar125,
                            CONCAT48(auVar14._8_4_ * fVar203,
                                     CONCAT44(auVar14._4_4_ * fVar113,auVar14._0_4_ * fVar93))));
    auVar15 = vfmadd231ps_fma(auVar39,auVar87,ZEXT1632(auVar15));
    auVar132 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar125 * auVar6._12_4_,
                                                  CONCAT48(fVar203 * auVar6._8_4_,
                                                           CONCAT44(fVar113 * auVar6._4_4_,
                                                                    fVar93 * auVar6._0_4_)))),
                               auVar87,ZEXT1632(auVar132));
    auVar111._0_4_ = auVar128._0_4_ + auVar259._0_4_;
    auVar111._4_4_ = auVar128._4_4_ + auVar259._4_4_;
    auVar111._8_4_ = auVar128._8_4_ + auVar259._8_4_;
    auVar111._12_4_ = auVar128._12_4_ + auVar259._12_4_;
    auVar111._16_4_ = auVar259._16_4_ + 0.0;
    auVar111._20_4_ = auVar259._20_4_ + 0.0;
    auVar111._24_4_ = auVar259._24_4_ + 0.0;
    auVar111._28_4_ = 0;
    auVar14 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar252._12_4_ * fVar125,
                                                 CONCAT48(auVar252._8_4_ * fVar203,
                                                          CONCAT44(auVar252._4_4_ * fVar113,
                                                                   auVar252._0_4_ * fVar93)))),
                              auVar87,ZEXT1632(auVar14));
    auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar154._12_4_ * fVar125,
                                                CONCAT48(auVar154._8_4_ * fVar203,
                                                         CONCAT44(auVar154._4_4_ * fVar113,
                                                                  auVar154._0_4_ * fVar93)))),
                             auVar87,ZEXT1632(auVar6));
    auVar252 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar125 * auVar14._12_4_,
                                                  CONCAT48(fVar203 * auVar14._8_4_,
                                                           CONCAT44(fVar113 * auVar14._4_4_,
                                                                    fVar93 * auVar14._0_4_)))),
                               auVar87,ZEXT1632(auVar15));
    auVar154 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * fVar125,
                                                  CONCAT48(auVar6._8_4_ * fVar203,
                                                           CONCAT44(auVar6._4_4_ * fVar113,
                                                                    auVar6._0_4_ * fVar93)))),
                               ZEXT1632(auVar132),auVar87);
    auVar87 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
    auVar16 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar132));
    auVar280._0_4_ = fStack_268 * auVar87._0_4_ * 3.0;
    auVar280._4_4_ = fStack_268 * auVar87._4_4_ * 3.0;
    auVar280._8_4_ = fStack_268 * auVar87._8_4_ * 3.0;
    auVar280._12_4_ = fStack_268 * auVar87._12_4_ * 3.0;
    auVar280._16_4_ = fStack_268 * auVar87._16_4_ * 3.0;
    auVar280._20_4_ = fStack_268 * auVar87._20_4_ * 3.0;
    auVar280._24_4_ = fStack_268 * auVar87._24_4_ * 3.0;
    auVar280._28_4_ = 0;
    local_280 = fStack_268 * auVar16._0_4_ * 3.0;
    fStack_27c = fStack_268 * auVar16._4_4_ * 3.0;
    auVar40._4_4_ = fStack_27c;
    auVar40._0_4_ = local_280;
    fStack_278 = fStack_268 * auVar16._8_4_ * 3.0;
    auVar40._8_4_ = fStack_278;
    fStack_274 = fStack_268 * auVar16._12_4_ * 3.0;
    auVar40._12_4_ = fStack_274;
    fStack_270 = fStack_268 * auVar16._16_4_ * 3.0;
    auVar40._16_4_ = fStack_270;
    fStack_26c = fStack_268 * auVar16._20_4_ * 3.0;
    auVar40._20_4_ = fStack_26c;
    fStack_268 = fStack_268 * auVar16._24_4_ * 3.0;
    auVar40._24_4_ = fStack_268;
    auVar40._28_4_ = 0x40400000;
    auVar22 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar252));
    _local_4e0 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar154));
    auVar87 = vsubps_avx(ZEXT1632(auVar252),ZEXT1632(auVar128));
    auVar16 = vsubps_avx(ZEXT1632(auVar154),ZEXT1632(auVar131));
    auVar17 = vsubps_avx(auVar22,auVar20);
    fVar263 = auVar87._0_4_ + auVar17._0_4_;
    fVar264 = auVar87._4_4_ + auVar17._4_4_;
    fVar197 = auVar87._8_4_ + auVar17._8_4_;
    fVar198 = auVar87._12_4_ + auVar17._12_4_;
    fVar199 = auVar87._16_4_ + auVar17._16_4_;
    fVar200 = auVar87._20_4_ + auVar17._20_4_;
    fVar201 = auVar87._24_4_ + auVar17._24_4_;
    auVar18 = vsubps_avx(_local_4e0,auVar21);
    auVar89._0_4_ = auVar16._0_4_ + auVar18._0_4_;
    auVar89._4_4_ = auVar16._4_4_ + auVar18._4_4_;
    auVar89._8_4_ = auVar16._8_4_ + auVar18._8_4_;
    auVar89._12_4_ = auVar16._12_4_ + auVar18._12_4_;
    auVar89._16_4_ = auVar16._16_4_ + auVar18._16_4_;
    auVar89._20_4_ = auVar16._20_4_ + auVar18._20_4_;
    auVar89._24_4_ = auVar16._24_4_ + auVar18._24_4_;
    auVar89._28_4_ = auVar16._28_4_ + auVar18._28_4_;
    local_220 = ZEXT1632(auVar131);
    fVar93 = auVar131._0_4_;
    local_2a0 = (float)local_5c0._0_4_ + fVar93;
    fVar113 = auVar131._4_4_;
    fStack_29c = (float)local_5c0._4_4_ + fVar113;
    fVar203 = auVar131._8_4_;
    fStack_298 = fStack_5b8 + fVar203;
    fVar125 = auVar131._12_4_;
    fStack_294 = fStack_5b4 + fVar125;
    fStack_290 = fStack_5b0 + 0.0;
    fStack_28c = fStack_5ac + 0.0;
    fStack_288 = fStack_5a8 + 0.0;
    local_1e0 = ZEXT1632(auVar128);
    auVar16 = vsubps_avx(local_1e0,auVar259);
    local_200 = vpermps_avx2(_DAT_01fec480,auVar16);
    auVar16 = vsubps_avx(local_220,_local_5c0);
    local_2c0 = vpermps_avx2(_DAT_01fec480,auVar16);
    local_240._0_4_ = auVar252._0_4_ + auVar280._0_4_;
    local_240._4_4_ = auVar252._4_4_ + auVar280._4_4_;
    local_240._8_4_ = auVar252._8_4_ + auVar280._8_4_;
    local_240._12_4_ = auVar252._12_4_ + auVar280._12_4_;
    local_240._16_4_ = auVar280._16_4_ + 0.0;
    local_240._20_4_ = auVar280._20_4_ + 0.0;
    local_240._24_4_ = auVar280._24_4_ + 0.0;
    local_240._28_4_ = 0;
    auVar230 = ZEXT3264(local_240);
    auVar260 = ZEXT1632(auVar252);
    auVar16 = vsubps_avx(auVar260,auVar280);
    _local_5c0 = vpermps_avx2(_DAT_01fec480,auVar16);
    fVar94 = auVar154._0_4_;
    local_280 = fVar94 + local_280;
    fVar164 = auVar154._4_4_;
    fStack_27c = fVar164 + fStack_27c;
    fVar71 = auVar154._8_4_;
    fStack_278 = fVar71 + fStack_278;
    fVar232 = auVar154._12_4_;
    fStack_274 = fVar232 + fStack_274;
    fStack_270 = fStack_270 + 0.0;
    fStack_26c = fStack_26c + 0.0;
    fStack_268 = fStack_268 + 0.0;
    auVar16 = vsubps_avx(ZEXT1632(auVar154),auVar40);
    local_260 = vpermps_avx2(_DAT_01fec480,auVar16);
    auVar41._4_4_ = fVar113 * fVar264;
    auVar41._0_4_ = fVar93 * fVar263;
    auVar41._8_4_ = fVar203 * fVar197;
    auVar41._12_4_ = fVar125 * fVar198;
    auVar41._16_4_ = fVar199 * 0.0;
    auVar41._20_4_ = fVar200 * 0.0;
    auVar41._24_4_ = fVar201 * 0.0;
    auVar41._28_4_ = auVar16._28_4_;
    auVar14 = vfnmadd231ps_fma(auVar41,local_1e0,auVar89);
    fStack_284 = fVar72 + 0.0;
    auVar42._4_4_ = fStack_29c * fVar264;
    auVar42._0_4_ = local_2a0 * fVar263;
    auVar42._8_4_ = fStack_298 * fVar197;
    auVar42._12_4_ = fStack_294 * fVar198;
    auVar42._16_4_ = fStack_290 * fVar199;
    auVar42._20_4_ = fStack_28c * fVar200;
    auVar42._24_4_ = fStack_288 * fVar201;
    auVar42._28_4_ = 0;
    auVar15 = vfnmadd231ps_fma(auVar42,auVar89,auVar111);
    auVar43._4_4_ = local_2c0._4_4_ * fVar264;
    auVar43._0_4_ = local_2c0._0_4_ * fVar263;
    auVar43._8_4_ = local_2c0._8_4_ * fVar197;
    auVar43._12_4_ = local_2c0._12_4_ * fVar198;
    auVar43._16_4_ = local_2c0._16_4_ * fVar199;
    auVar43._20_4_ = local_2c0._20_4_ * fVar200;
    auVar43._24_4_ = local_2c0._24_4_ * fVar201;
    auVar43._28_4_ = fVar72 + 0.0;
    auVar132 = vfnmadd231ps_fma(auVar43,local_200,auVar89);
    local_780._0_4_ = auVar21._0_4_;
    local_780._4_4_ = auVar21._4_4_;
    uStack_778._0_4_ = auVar21._8_4_;
    uStack_778._4_4_ = auVar21._12_4_;
    uStack_770._0_4_ = auVar21._16_4_;
    uStack_770._4_4_ = auVar21._20_4_;
    uStack_768._0_4_ = auVar21._24_4_;
    uStack_768._4_4_ = auVar21._28_4_;
    auVar44._4_4_ = (float)local_780._4_4_ * fVar264;
    auVar44._0_4_ = (float)local_780._0_4_ * fVar263;
    auVar44._8_4_ = (float)uStack_778 * fVar197;
    auVar44._12_4_ = uStack_778._4_4_ * fVar198;
    auVar44._16_4_ = (float)uStack_770 * fVar199;
    auVar44._20_4_ = uStack_770._4_4_ * fVar200;
    auVar44._24_4_ = (float)uStack_768 * fVar201;
    auVar44._28_4_ = uStack_768._4_4_;
    auVar6 = vfnmadd231ps_fma(auVar44,auVar20,auVar89);
    auVar213._0_4_ = fVar94 * fVar263;
    auVar213._4_4_ = fVar164 * fVar264;
    auVar213._8_4_ = fVar71 * fVar197;
    auVar213._12_4_ = fVar232 * fVar198;
    auVar213._16_4_ = fVar199 * 0.0;
    auVar213._20_4_ = fVar200 * 0.0;
    auVar213._24_4_ = fVar201 * 0.0;
    auVar213._28_4_ = 0;
    auVar252 = vfnmadd231ps_fma(auVar213,auVar260,auVar89);
    uStack_264 = 0x40400000;
    auVar45._4_4_ = fStack_27c * fVar264;
    auVar45._0_4_ = local_280 * fVar263;
    auVar45._8_4_ = fStack_278 * fVar197;
    auVar45._12_4_ = fStack_274 * fVar198;
    auVar45._16_4_ = fStack_270 * fVar199;
    auVar45._20_4_ = fStack_26c * fVar200;
    auVar45._24_4_ = fStack_268 * fVar201;
    auVar45._28_4_ = auVar20._28_4_;
    auVar131 = vfnmadd231ps_fma(auVar45,local_240,auVar89);
    auVar46._4_4_ = local_260._4_4_ * fVar264;
    auVar46._0_4_ = local_260._0_4_ * fVar263;
    auVar46._8_4_ = local_260._8_4_ * fVar197;
    auVar46._12_4_ = local_260._12_4_ * fVar198;
    auVar46._16_4_ = local_260._16_4_ * fVar199;
    auVar46._20_4_ = local_260._20_4_ * fVar200;
    auVar46._24_4_ = local_260._24_4_ * fVar201;
    auVar46._28_4_ = local_260._28_4_;
    auVar244 = vfnmadd231ps_fma(auVar46,_local_5c0,auVar89);
    auVar47._4_4_ = local_4e0._4_4_ * fVar264;
    auVar47._0_4_ = local_4e0._0_4_ * fVar263;
    auVar47._8_4_ = local_4e0._8_4_ * fVar197;
    auVar47._12_4_ = local_4e0._12_4_ * fVar198;
    auVar47._16_4_ = local_4e0._16_4_ * fVar199;
    auVar47._20_4_ = local_4e0._20_4_ * fVar200;
    auVar47._24_4_ = local_4e0._24_4_ * fVar201;
    auVar47._28_4_ = auVar87._28_4_ + auVar17._28_4_;
    auVar74 = vfnmadd231ps_fma(auVar47,auVar22,auVar89);
    auVar16 = vminps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
    auVar87 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
    auVar17 = vminps_avx(ZEXT1632(auVar132),ZEXT1632(auVar6));
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(ZEXT1632(auVar132),ZEXT1632(auVar6));
    auVar87 = vmaxps_avx(auVar87,auVar16);
    auVar18 = vminps_avx(ZEXT1632(auVar252),ZEXT1632(auVar131));
    auVar16 = vmaxps_avx(ZEXT1632(auVar252),ZEXT1632(auVar131));
    auVar19 = vminps_avx(ZEXT1632(auVar244),ZEXT1632(auVar74));
    auVar18 = vminps_avx(auVar18,auVar19);
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(ZEXT1632(auVar244),ZEXT1632(auVar74));
    auVar16 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar87,auVar16);
    auVar56._4_4_ = fStack_39c;
    auVar56._0_4_ = local_3a0;
    auVar56._8_4_ = fStack_398;
    auVar56._12_4_ = fStack_394;
    auVar56._16_4_ = fStack_390;
    auVar56._20_4_ = fStack_38c;
    auVar56._24_4_ = fStack_388;
    auVar56._28_4_ = fStack_384;
    auVar87 = vcmpps_avx(auVar18,auVar56,2);
    auVar58._4_4_ = fStack_1bc;
    auVar58._0_4_ = local_1c0;
    auVar58._8_4_ = fStack_1b8;
    auVar58._12_4_ = fStack_1b4;
    auVar58._16_4_ = fStack_1b0;
    auVar58._20_4_ = fStack_1ac;
    auVar58._24_4_ = fStack_1a8;
    auVar58._28_4_ = fStack_1a4;
    auVar16 = vcmpps_avx(auVar16,auVar58,5);
    auVar87 = vandps_avx(auVar16,auVar87);
    auVar16 = local_2e0 & auVar87;
    if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0x7f,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0xbf,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0')
    {
      auVar16 = vsubps_avx(auVar20,local_1e0);
      auVar17 = vsubps_avx(auVar22,auVar260);
      fVar263 = auVar16._0_4_ + auVar17._0_4_;
      fVar264 = auVar16._4_4_ + auVar17._4_4_;
      fVar197 = auVar16._8_4_ + auVar17._8_4_;
      fVar198 = auVar16._12_4_ + auVar17._12_4_;
      fVar199 = auVar16._16_4_ + auVar17._16_4_;
      fVar200 = auVar16._20_4_ + auVar17._20_4_;
      fVar201 = auVar16._24_4_ + auVar17._24_4_;
      auVar18 = vsubps_avx(auVar21,local_220);
      auVar19 = vsubps_avx(_local_4e0,ZEXT1632(auVar154));
      auVar112._0_4_ = auVar18._0_4_ + auVar19._0_4_;
      auVar112._4_4_ = auVar18._4_4_ + auVar19._4_4_;
      auVar112._8_4_ = auVar18._8_4_ + auVar19._8_4_;
      auVar112._12_4_ = auVar18._12_4_ + auVar19._12_4_;
      auVar112._16_4_ = auVar18._16_4_ + auVar19._16_4_;
      auVar112._20_4_ = auVar18._20_4_ + auVar19._20_4_;
      auVar112._24_4_ = auVar18._24_4_ + auVar19._24_4_;
      fVar72 = auVar19._28_4_;
      auVar112._28_4_ = auVar18._28_4_ + fVar72;
      auVar48._4_4_ = fVar113 * fVar264;
      auVar48._0_4_ = fVar93 * fVar263;
      auVar48._8_4_ = fVar203 * fVar197;
      auVar48._12_4_ = fVar125 * fVar198;
      auVar48._16_4_ = fVar199 * 0.0;
      auVar48._20_4_ = fVar200 * 0.0;
      auVar48._24_4_ = fVar201 * 0.0;
      auVar48._28_4_ = auVar22._28_4_;
      auVar252 = vfnmadd231ps_fma(auVar48,auVar112,local_1e0);
      auVar49._4_4_ = fVar264 * fStack_29c;
      auVar49._0_4_ = fVar263 * local_2a0;
      auVar49._8_4_ = fVar197 * fStack_298;
      auVar49._12_4_ = fVar198 * fStack_294;
      auVar49._16_4_ = fVar199 * fStack_290;
      auVar49._20_4_ = fVar200 * fStack_28c;
      auVar49._24_4_ = fVar201 * fStack_288;
      auVar49._28_4_ = 0;
      auVar14 = vfnmadd213ps_fma(auVar111,auVar112,auVar49);
      auVar50._4_4_ = fVar264 * local_2c0._4_4_;
      auVar50._0_4_ = fVar263 * local_2c0._0_4_;
      auVar50._8_4_ = fVar197 * local_2c0._8_4_;
      auVar50._12_4_ = fVar198 * local_2c0._12_4_;
      auVar50._16_4_ = fVar199 * local_2c0._16_4_;
      auVar50._20_4_ = fVar200 * local_2c0._20_4_;
      auVar50._24_4_ = fVar201 * local_2c0._24_4_;
      auVar50._28_4_ = 0;
      auVar15 = vfnmadd213ps_fma(local_200,auVar112,auVar50);
      auVar51._4_4_ = (float)local_780._4_4_ * fVar264;
      auVar51._0_4_ = (float)local_780._0_4_ * fVar263;
      auVar51._8_4_ = (float)uStack_778 * fVar197;
      auVar51._12_4_ = uStack_778._4_4_ * fVar198;
      auVar51._16_4_ = (float)uStack_770 * fVar199;
      auVar51._20_4_ = uStack_770._4_4_ * fVar200;
      auVar51._24_4_ = (float)uStack_768 * fVar201;
      auVar51._28_4_ = 0;
      auVar154 = vfnmadd231ps_fma(auVar51,auVar112,auVar20);
      auVar137._0_4_ = fVar94 * fVar263;
      auVar137._4_4_ = fVar164 * fVar264;
      auVar137._8_4_ = fVar71 * fVar197;
      auVar137._12_4_ = fVar232 * fVar198;
      auVar137._16_4_ = fVar199 * 0.0;
      auVar137._20_4_ = fVar200 * 0.0;
      auVar137._24_4_ = fVar201 * 0.0;
      auVar137._28_4_ = 0;
      auVar131 = vfnmadd231ps_fma(auVar137,auVar112,auVar260);
      auVar52._4_4_ = fVar264 * fStack_27c;
      auVar52._0_4_ = fVar263 * local_280;
      auVar52._8_4_ = fVar197 * fStack_278;
      auVar52._12_4_ = fVar198 * fStack_274;
      auVar52._16_4_ = fVar199 * fStack_270;
      auVar52._20_4_ = fVar200 * fStack_26c;
      auVar52._24_4_ = fVar201 * fStack_268;
      auVar52._28_4_ = fVar72;
      auVar132 = vfnmadd213ps_fma(local_240,auVar112,auVar52);
      auVar53._4_4_ = fVar264 * local_260._4_4_;
      auVar53._0_4_ = fVar263 * local_260._0_4_;
      auVar53._8_4_ = fVar197 * local_260._8_4_;
      auVar53._12_4_ = fVar198 * local_260._12_4_;
      auVar53._16_4_ = fVar199 * local_260._16_4_;
      auVar53._20_4_ = fVar200 * local_260._20_4_;
      auVar53._24_4_ = fVar201 * local_260._24_4_;
      auVar53._28_4_ = fVar72;
      auVar6 = vfnmadd213ps_fma(_local_5c0,auVar112,auVar53);
      auVar230 = ZEXT1664(auVar6);
      auVar54._4_4_ = fVar264 * local_4e0._4_4_;
      auVar54._0_4_ = fVar263 * local_4e0._0_4_;
      auVar54._8_4_ = fVar197 * local_4e0._8_4_;
      auVar54._12_4_ = fVar198 * local_4e0._12_4_;
      auVar54._16_4_ = fVar199 * local_4e0._16_4_;
      auVar54._20_4_ = fVar200 * local_4e0._20_4_;
      auVar54._24_4_ = fVar201 * local_4e0._24_4_;
      auVar54._28_4_ = auVar16._28_4_ + auVar17._28_4_;
      auVar244 = vfnmadd231ps_fma(auVar54,auVar112,auVar22);
      auVar17 = vminps_avx(ZEXT1632(auVar252),ZEXT1632(auVar14));
      auVar16 = vmaxps_avx(ZEXT1632(auVar252),ZEXT1632(auVar14));
      auVar18 = vminps_avx(ZEXT1632(auVar15),ZEXT1632(auVar154));
      auVar18 = vminps_avx(auVar17,auVar18);
      auVar17 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar154));
      auVar16 = vmaxps_avx(auVar16,auVar17);
      auVar19 = vminps_avx(ZEXT1632(auVar131),ZEXT1632(auVar132));
      auVar17 = vmaxps_avx(ZEXT1632(auVar131),ZEXT1632(auVar132));
      auVar20 = vminps_avx(ZEXT1632(auVar6),ZEXT1632(auVar244));
      auVar19 = vminps_avx(auVar19,auVar20);
      auVar19 = vminps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(auVar244));
      auVar17 = vmaxps_avx(auVar17,auVar18);
      auVar17 = vmaxps_avx(auVar16,auVar17);
      auVar57._4_4_ = fStack_39c;
      auVar57._0_4_ = local_3a0;
      auVar57._8_4_ = fStack_398;
      auVar57._12_4_ = fStack_394;
      auVar57._16_4_ = fStack_390;
      auVar57._20_4_ = fStack_38c;
      auVar57._24_4_ = fStack_388;
      auVar57._28_4_ = fStack_384;
      auVar16 = vcmpps_avx(auVar19,auVar57,2);
      auVar17 = vcmpps_avx(auVar17,auVar58,5);
      auVar16 = vandps_avx(auVar17,auVar16);
      auVar87 = vandps_avx(auVar87,local_2e0);
      auVar17 = auVar87 & auVar16;
      if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0x7f,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0xbf,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar17[0x1f] < '\0') {
        auVar87 = vandps_avx(auVar16,auVar87);
        uVar65 = vmovmskps_avx(auVar87);
        if (uVar65 != 0) {
          uVar66 = (ulong)uVar68;
          auStack_4f0[uVar66] = uVar65 & 0xff;
          uVar95 = vmovlps_avx(local_450);
          *(undefined8 *)(&uStack_380 + uVar66 * 2) = uVar95;
          uVar61 = vmovlps_avx(auVar75);
          auStack_1a0[uVar66] = uVar61;
          uVar68 = uVar68 + 1;
        }
      }
    }
    if (uVar68 != 0) {
      do {
        uVar66 = (ulong)(uVar68 - 1);
        uVar64 = auStack_4f0[uVar66];
        uVar65 = (&uStack_380)[uVar66 * 2];
        fVar93 = afStack_37c[uVar66 * 2];
        iVar60 = 0;
        for (uVar61 = (ulong)uVar64; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
          iVar60 = iVar60 + 1;
        }
        uVar64 = uVar64 - 1 & uVar64;
        if (uVar64 == 0) {
          uVar68 = uVar68 - 1;
        }
        auVar75._8_8_ = 0;
        auVar75._0_8_ = auStack_1a0[uVar66];
        auStack_4f0[uVar66] = uVar64;
        fVar113 = (float)(iVar60 + 1) * 0.14285715;
        auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar93 * (float)iVar60 * 0.14285715)),
                                  ZEXT416(uVar65),ZEXT416((uint)(1.0 - (float)iVar60 * 0.14285715)))
        ;
        auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar93 * fVar113)),ZEXT416(uVar65),
                                  ZEXT416((uint)(1.0 - fVar113)));
        fVar113 = auVar15._0_4_;
        fVar203 = auVar14._0_4_;
        fVar93 = fVar113 - fVar203;
        if (0.16666667 <= fVar93) {
          local_450 = vinsertps_avx(auVar14,auVar15,0x10);
          goto LAB_017acae1;
        }
        auVar132 = vshufps_avx(auVar75,auVar75,0x50);
        auVar99._8_4_ = 0x3f800000;
        auVar99._0_8_ = 0x3f8000003f800000;
        auVar99._12_4_ = 0x3f800000;
        auVar6 = vsubps_avx(auVar99,auVar132);
        fVar125 = auVar132._0_4_;
        auVar142._0_4_ = fVar125 * fVar139;
        fVar94 = auVar132._4_4_;
        auVar142._4_4_ = fVar94 * fVar148;
        fVar72 = auVar132._8_4_;
        auVar142._8_4_ = fVar72 * fVar139;
        fVar164 = auVar132._12_4_;
        auVar142._12_4_ = fVar164 * fVar148;
        auVar152._0_4_ = fVar125 * fVar248;
        auVar152._4_4_ = fVar94 * fVar262;
        auVar152._8_4_ = fVar72 * fVar248;
        auVar152._12_4_ = fVar164 * fVar262;
        auVar177._0_4_ = fVar125 * fVar202;
        auVar177._4_4_ = fVar94 * fVar214;
        auVar177._8_4_ = fVar72 * fVar202;
        auVar177._12_4_ = fVar164 * fVar214;
        auVar77._0_4_ = fVar125 * fVar215;
        auVar77._4_4_ = fVar94 * fVar231;
        auVar77._8_4_ = fVar72 * fVar215;
        auVar77._12_4_ = fVar164 * fVar231;
        auVar132 = vfmadd231ps_fma(auVar142,auVar6,auVar187);
        auVar252 = vfmadd231ps_fma(auVar152,auVar6,auVar234);
        auVar154 = vfmadd231ps_fma(auVar177,auVar6,auVar251);
        auVar6 = vfmadd231ps_fma(auVar77,auVar6,auVar266);
        auVar138._16_16_ = auVar132;
        auVar138._0_16_ = auVar132;
        auVar147._16_16_ = auVar252;
        auVar147._0_16_ = auVar252;
        auVar162._16_16_ = auVar154;
        auVar162._0_16_ = auVar154;
        auVar196._4_4_ = fVar203;
        auVar196._0_4_ = fVar203;
        auVar196._8_4_ = fVar203;
        auVar196._12_4_ = fVar203;
        auVar196._20_4_ = fVar113;
        auVar196._16_4_ = fVar113;
        auVar196._24_4_ = fVar113;
        auVar196._28_4_ = fVar113;
        auVar87 = vsubps_avx(auVar147,auVar138);
        auVar252 = vfmadd213ps_fma(auVar87,auVar196,auVar138);
        auVar87 = vsubps_avx(auVar162,auVar147);
        auVar131 = vfmadd213ps_fma(auVar87,auVar196,auVar147);
        auVar132 = vsubps_avx(auVar6,auVar154);
        auVar90._16_16_ = auVar132;
        auVar90._0_16_ = auVar132;
        auVar132 = vfmadd213ps_fma(auVar90,auVar196,auVar162);
        auVar87 = vsubps_avx(ZEXT1632(auVar131),ZEXT1632(auVar252));
        auVar6 = vfmadd213ps_fma(auVar87,auVar196,ZEXT1632(auVar252));
        auVar87 = vsubps_avx(ZEXT1632(auVar132),ZEXT1632(auVar131));
        auVar132 = vfmadd213ps_fma(auVar87,auVar196,ZEXT1632(auVar131));
        auVar87 = vsubps_avx(ZEXT1632(auVar132),ZEXT1632(auVar6));
        auVar74 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar87,auVar196);
        fVar232 = auVar87._4_4_ * 3.0;
        fVar125 = fVar93 * 0.33333334;
        auVar188._0_8_ =
             CONCAT44(auVar74._4_4_ + fVar125 * fVar232,
                      auVar74._0_4_ + fVar125 * auVar87._0_4_ * 3.0);
        auVar188._8_4_ = auVar74._8_4_ + fVar125 * auVar87._8_4_ * 3.0;
        auVar188._12_4_ = auVar74._12_4_ + fVar125 * auVar87._12_4_ * 3.0;
        _local_4e0 = vshufpd_avx(auVar74,auVar74,3);
        auVar6 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar132 = vsubps_avx(_local_4e0,auVar74);
        auVar252 = vsubps_avx(auVar6,(undefined1  [16])0x0);
        auVar78._0_4_ = auVar132._0_4_ + auVar252._0_4_;
        auVar78._4_4_ = auVar132._4_4_ + auVar252._4_4_;
        auVar78._8_4_ = auVar132._8_4_ + auVar252._8_4_;
        auVar78._12_4_ = auVar132._12_4_ + auVar252._12_4_;
        auVar132 = vshufps_avx(auVar74,auVar74,0xb1);
        auVar252 = vshufps_avx(auVar188,auVar188,0xb1);
        auVar274._4_4_ = auVar78._0_4_;
        auVar274._0_4_ = auVar78._0_4_;
        auVar274._8_4_ = auVar78._0_4_;
        auVar274._12_4_ = auVar78._0_4_;
        auVar154 = vshufps_avx(auVar78,auVar78,0x55);
        fVar94 = auVar154._0_4_;
        auVar79._0_4_ = fVar94 * auVar132._0_4_;
        fVar72 = auVar154._4_4_;
        auVar79._4_4_ = fVar72 * auVar132._4_4_;
        fVar164 = auVar154._8_4_;
        auVar79._8_4_ = fVar164 * auVar132._8_4_;
        fVar71 = auVar154._12_4_;
        auVar79._12_4_ = fVar71 * auVar132._12_4_;
        auVar153._0_4_ = fVar94 * auVar252._0_4_;
        auVar153._4_4_ = fVar72 * auVar252._4_4_;
        auVar153._8_4_ = fVar164 * auVar252._8_4_;
        auVar153._12_4_ = fVar71 * auVar252._12_4_;
        auVar131 = vfmadd231ps_fma(auVar79,auVar274,auVar74);
        _local_5c0 = auVar188;
        auVar244 = vfmadd231ps_fma(auVar153,auVar274,auVar188);
        auVar252 = vshufps_avx(auVar131,auVar131,0xe8);
        auVar154 = vshufps_avx(auVar244,auVar244,0xe8);
        auVar132 = vcmpps_avx(auVar252,auVar154,1);
        uVar65 = vextractps_avx(auVar132,0);
        auVar96 = auVar244;
        if ((uVar65 & 1) == 0) {
          auVar96 = auVar131;
        }
        auVar127._0_4_ = fVar125 * auVar87._16_4_ * 3.0;
        auVar127._4_4_ = fVar125 * fVar232;
        auVar127._8_4_ = fVar125 * auVar87._24_4_ * 3.0;
        auVar127._12_4_ = fVar125 * auVar230._28_4_;
        auVar114 = vsubps_avx((undefined1  [16])0x0,auVar127);
        auVar128 = vshufps_avx(auVar114,auVar114,0xb1);
        auVar97 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar189._0_4_ = fVar94 * auVar128._0_4_;
        auVar189._4_4_ = fVar72 * auVar128._4_4_;
        auVar189._8_4_ = fVar164 * auVar128._8_4_;
        auVar189._12_4_ = fVar71 * auVar128._12_4_;
        auVar207._0_4_ = auVar97._0_4_ * fVar94;
        auVar207._4_4_ = auVar97._4_4_ * fVar72;
        auVar207._8_4_ = auVar97._8_4_ * fVar164;
        auVar207._12_4_ = auVar97._12_4_ * fVar71;
        auVar115 = vfmadd231ps_fma(auVar189,auVar274,auVar114);
        auVar126 = vfmadd231ps_fma(auVar207,(undefined1  [16])0x0,auVar274);
        auVar97 = vshufps_avx(auVar115,auVar115,0xe8);
        auVar98 = vshufps_avx(auVar126,auVar126,0xe8);
        auVar230 = ZEXT1664(auVar98);
        auVar128 = vcmpps_avx(auVar97,auVar98,1);
        uVar65 = vextractps_avx(auVar128,0);
        auVar140 = auVar126;
        if ((uVar65 & 1) == 0) {
          auVar140 = auVar115;
        }
        auVar96 = vmaxss_avx(auVar140,auVar96);
        auVar252 = vminps_avx(auVar252,auVar154);
        auVar154 = vminps_avx(auVar97,auVar98);
        auVar154 = vminps_avx(auVar252,auVar154);
        auVar132 = vshufps_avx(auVar132,auVar132,0x55);
        auVar132 = vblendps_avx(auVar132,auVar128,2);
        auVar128 = vpslld_avx(auVar132,0x1f);
        auVar132 = vshufpd_avx(auVar244,auVar244,1);
        auVar132 = vinsertps_avx(auVar132,auVar126,0x9c);
        auVar252 = vshufpd_avx(auVar131,auVar131,1);
        auVar252 = vinsertps_avx(auVar252,auVar115,0x9c);
        auVar132 = vblendvps_avx(auVar252,auVar132,auVar128);
        auVar252 = vmovshdup_avx(auVar132);
        auVar132 = vmaxss_avx(auVar252,auVar132);
        fVar164 = auVar154._0_4_;
        auVar252 = vmovshdup_avx(auVar154);
        fVar72 = auVar132._0_4_;
        fVar125 = auVar252._0_4_;
        fVar94 = auVar96._0_4_;
        if (((fVar164 < 0.0001) && (-0.0001 < fVar72)) || (fVar125 < 0.0001 && -0.0001 < fVar72)) {
LAB_017ad39c:
          auVar230 = ZEXT1664(auVar114);
          auVar131 = vcmpps_avx(auVar154,_DAT_01f7aa10,1);
          auVar244 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar252 = vcmpss_avx(auVar96,ZEXT816(0) << 0x20,1);
          auVar100._8_4_ = 0x3f800000;
          auVar100._0_8_ = 0x3f8000003f800000;
          auVar100._12_4_ = 0x3f800000;
          auVar117._8_4_ = 0xbf800000;
          auVar117._0_8_ = 0xbf800000bf800000;
          auVar117._12_4_ = 0xbf800000;
          auVar252 = vblendvps_avx(auVar100,auVar117,auVar252);
          auVar131 = vblendvps_avx(auVar100,auVar117,auVar131);
          fVar232 = auVar131._0_4_;
          fVar71 = auVar252._0_4_;
          auVar252 = SUB6416(ZEXT864(0),0) << 0x20;
          if ((fVar232 == fVar71) && (!NAN(fVar232) && !NAN(fVar71))) {
            auVar252 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar232 == fVar71) && (!NAN(fVar232) && !NAN(fVar71))) {
            auVar244 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar131 = vmovshdup_avx(auVar131);
          fVar263 = auVar131._0_4_;
          if ((fVar232 != fVar263) || (NAN(fVar232) || NAN(fVar263))) {
            if ((fVar125 != fVar164) || (NAN(fVar125) || NAN(fVar164))) {
              auVar129._0_8_ = auVar154._0_8_ ^ 0x8000000080000000;
              auVar129._8_4_ = auVar154._8_4_ ^ 0x80000000;
              auVar129._12_4_ = auVar154._12_4_ ^ 0x80000000;
              auVar130._0_4_ = -fVar164 / (fVar125 - fVar164);
              auVar130._4_12_ = auVar129._4_12_;
              auVar154 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar130._0_4_)),auVar130,ZEXT416(0));
              auVar131 = auVar154;
            }
            else {
              auVar154 = ZEXT816(0) << 0x20;
              if ((fVar164 != 0.0) || (auVar131 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar164))) {
                auVar154 = SUB6416(ZEXT464(0x7f800000),0);
                auVar131 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar252 = vminss_avx(auVar252,auVar154);
            auVar244 = vmaxss_avx(auVar131,auVar244);
          }
          auVar132 = vcmpss_avx(auVar132,ZEXT416(0),1);
          auVar101._8_4_ = 0x3f800000;
          auVar101._0_8_ = 0x3f8000003f800000;
          auVar101._12_4_ = 0x3f800000;
          auVar118._8_4_ = 0xbf800000;
          auVar118._0_8_ = 0xbf800000bf800000;
          auVar118._12_4_ = 0xbf800000;
          auVar132 = vblendvps_avx(auVar101,auVar118,auVar132);
          fVar125 = auVar132._0_4_;
          if ((fVar71 != fVar125) || (NAN(fVar71) || NAN(fVar125))) {
            if ((fVar72 != fVar94) || (NAN(fVar72) || NAN(fVar94))) {
              auVar80._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
              auVar80._8_4_ = auVar96._8_4_ ^ 0x80000000;
              auVar80._12_4_ = auVar96._12_4_ ^ 0x80000000;
              auVar133._0_4_ = -fVar94 / (fVar72 - fVar94);
              auVar133._4_12_ = auVar80._4_12_;
              auVar132 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar133._0_4_)),auVar133,ZEXT416(0));
              auVar154 = auVar132;
            }
            else {
              auVar132 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar94 != 0.0) || (auVar154 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar94))) {
                auVar132 = SUB6416(ZEXT464(0xff800000),0);
                auVar154 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar252 = vminss_avx(auVar252,auVar154);
            auVar244 = vmaxss_avx(auVar132,auVar244);
          }
          if ((fVar263 != fVar125) || (NAN(fVar263) || NAN(fVar125))) {
            auVar252 = vminss_avx(auVar252,SUB6416(ZEXT464(0x3f800000),0));
            auVar244 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar244);
          }
          auVar132 = vmaxss_avx(ZEXT816(0) << 0x40,auVar252);
          auVar252 = vminss_avx(auVar244,SUB6416(ZEXT464(0x3f800000),0));
          if (auVar132._0_4_ <= auVar252._0_4_) {
            auVar132 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar132._0_4_ + -0.1)));
            auVar252 = vminss_avx(ZEXT416((uint)(auVar252._0_4_ + 0.1)),
                                  SUB6416(ZEXT464(0x3f800000),0));
            auVar143._0_8_ = auVar74._0_8_;
            auVar143._8_8_ = auVar143._0_8_;
            auVar221._8_8_ = auVar188._0_8_;
            auVar221._0_8_ = auVar188._0_8_;
            auVar235._8_8_ = auVar114._0_8_;
            auVar235._0_8_ = auVar114._0_8_;
            auVar154 = vshufpd_avx(auVar188,auVar188,3);
            auVar131 = vshufpd_avx(auVar114,auVar114,3);
            auVar244 = vshufps_avx(auVar132,auVar252,0);
            auVar81._8_4_ = 0x3f800000;
            auVar81._0_8_ = 0x3f8000003f800000;
            auVar81._12_4_ = 0x3f800000;
            auVar74 = vsubps_avx(auVar81,auVar244);
            fVar125 = auVar244._0_4_;
            auVar82._0_4_ = fVar125 * (float)local_4e0._0_4_;
            fVar94 = auVar244._4_4_;
            auVar82._4_4_ = fVar94 * (float)local_4e0._4_4_;
            fVar72 = auVar244._8_4_;
            auVar82._8_4_ = fVar72 * fStack_4d8;
            fVar164 = auVar244._12_4_;
            auVar82._12_4_ = fVar164 * fStack_4d4;
            auVar178._0_4_ = fVar125 * auVar154._0_4_;
            auVar178._4_4_ = fVar94 * auVar154._4_4_;
            auVar178._8_4_ = fVar72 * auVar154._8_4_;
            auVar178._12_4_ = fVar164 * auVar154._12_4_;
            auVar190._0_4_ = fVar125 * auVar131._0_4_;
            auVar190._4_4_ = fVar94 * auVar131._4_4_;
            auVar190._8_4_ = fVar72 * auVar131._8_4_;
            auVar190._12_4_ = fVar164 * auVar131._12_4_;
            local_640 = auVar6._0_4_;
            fStack_63c = auVar6._4_4_;
            fStack_638 = auVar6._8_4_;
            fStack_634 = auVar6._12_4_;
            auVar208._0_4_ = fVar125 * local_640;
            auVar208._4_4_ = fVar94 * fStack_63c;
            auVar208._8_4_ = fVar72 * fStack_638;
            auVar208._12_4_ = fVar164 * fStack_634;
            auVar131 = vfmadd231ps_fma(auVar82,auVar74,auVar143);
            auVar244 = vfmadd231ps_fma(auVar178,auVar74,auVar221);
            auVar96 = vfmadd231ps_fma(auVar190,auVar74,auVar235);
            auVar74 = vfmadd231ps_fma(auVar208,auVar74,ZEXT816(0));
            auVar6 = vmovshdup_avx(auVar75);
            auVar114 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * auVar132._0_4_)),auVar75,
                                       ZEXT416((uint)(1.0 - auVar132._0_4_)));
            auVar115 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * auVar252._0_4_)),auVar75,
                                       ZEXT416((uint)(1.0 - auVar252._0_4_)));
            fVar125 = 1.0 / fVar93;
            auVar132 = vsubps_avx(auVar244,auVar131);
            auVar222._0_4_ = auVar132._0_4_ * 3.0;
            auVar222._4_4_ = auVar132._4_4_ * 3.0;
            auVar222._8_4_ = auVar132._8_4_ * 3.0;
            auVar222._12_4_ = auVar132._12_4_ * 3.0;
            auVar132 = vsubps_avx(auVar96,auVar244);
            auVar236._0_4_ = auVar132._0_4_ * 3.0;
            auVar236._4_4_ = auVar132._4_4_ * 3.0;
            auVar236._8_4_ = auVar132._8_4_ * 3.0;
            auVar236._12_4_ = auVar132._12_4_ * 3.0;
            auVar132 = vsubps_avx(auVar74,auVar96);
            auVar245._0_4_ = auVar132._0_4_ * 3.0;
            auVar245._4_4_ = auVar132._4_4_ * 3.0;
            auVar245._8_4_ = auVar132._8_4_ * 3.0;
            auVar245._12_4_ = auVar132._12_4_ * 3.0;
            auVar6 = vminps_avx(auVar236,auVar245);
            auVar132 = vmaxps_avx(auVar236,auVar245);
            auVar6 = vminps_avx(auVar222,auVar6);
            auVar132 = vmaxps_avx(auVar222,auVar132);
            auVar252 = vshufpd_avx(auVar6,auVar6,3);
            auVar154 = vshufpd_avx(auVar132,auVar132,3);
            auVar6 = vminps_avx(auVar6,auVar252);
            auVar132 = vmaxps_avx(auVar132,auVar154);
            auVar237._0_4_ = auVar6._0_4_ * fVar125;
            auVar237._4_4_ = auVar6._4_4_ * fVar125;
            auVar237._8_4_ = auVar6._8_4_ * fVar125;
            auVar237._12_4_ = auVar6._12_4_ * fVar125;
            auVar223._0_4_ = auVar132._0_4_ * fVar125;
            auVar223._4_4_ = auVar132._4_4_ * fVar125;
            auVar223._8_4_ = auVar132._8_4_ * fVar125;
            auVar223._12_4_ = auVar132._12_4_ * fVar125;
            fVar125 = 1.0 / (auVar115._0_4_ - auVar114._0_4_);
            auVar132 = vshufpd_avx(auVar131,auVar131,3);
            auVar6 = vshufpd_avx(auVar244,auVar244,3);
            auVar252 = vshufpd_avx(auVar96,auVar96,3);
            auVar154 = vshufpd_avx(auVar74,auVar74,3);
            auVar132 = vsubps_avx(auVar132,auVar131);
            auVar75 = vsubps_avx(auVar6,auVar244);
            auVar131 = vsubps_avx(auVar252,auVar96);
            auVar154 = vsubps_avx(auVar154,auVar74);
            auVar6 = vminps_avx(auVar132,auVar75);
            auVar132 = vmaxps_avx(auVar132,auVar75);
            auVar252 = vminps_avx(auVar131,auVar154);
            auVar252 = vminps_avx(auVar6,auVar252);
            auVar6 = vmaxps_avx(auVar131,auVar154);
            auVar132 = vmaxps_avx(auVar132,auVar6);
            auVar267._0_4_ = fVar125 * auVar252._0_4_;
            auVar267._4_4_ = fVar125 * auVar252._4_4_;
            auVar267._8_4_ = fVar125 * auVar252._8_4_;
            auVar267._12_4_ = fVar125 * auVar252._12_4_;
            auVar253._0_4_ = fVar125 * auVar132._0_4_;
            auVar253._4_4_ = fVar125 * auVar132._4_4_;
            auVar253._8_4_ = fVar125 * auVar132._8_4_;
            auVar253._12_4_ = fVar125 * auVar132._12_4_;
            auVar154 = vinsertps_avx(auVar14,auVar114,0x10);
            auVar75 = vinsertps_avx(auVar15,auVar115,0x10);
            auVar246._0_4_ = (auVar154._0_4_ + auVar75._0_4_) * 0.5;
            auVar246._4_4_ = (auVar154._4_4_ + auVar75._4_4_) * 0.5;
            auVar246._8_4_ = (auVar154._8_4_ + auVar75._8_4_) * 0.5;
            auVar246._12_4_ = (auVar154._12_4_ + auVar75._12_4_) * 0.5;
            auVar83._4_4_ = auVar246._0_4_;
            auVar83._0_4_ = auVar246._0_4_;
            auVar83._8_4_ = auVar246._0_4_;
            auVar83._12_4_ = auVar246._0_4_;
            auVar132 = vfmadd213ps_fma(local_3c0,auVar83,local_500);
            auVar6 = vfmadd213ps_fma(local_3d0,auVar83,auVar3);
            auVar252 = vfmadd213ps_fma(local_3e0,auVar83,auVar4);
            auVar15 = vsubps_avx(auVar6,auVar132);
            auVar132 = vfmadd213ps_fma(auVar15,auVar83,auVar132);
            auVar15 = vsubps_avx(auVar252,auVar6);
            auVar15 = vfmadd213ps_fma(auVar15,auVar83,auVar6);
            auVar15 = vsubps_avx(auVar15,auVar132);
            auVar132 = vfmadd231ps_fma(auVar132,auVar15,auVar83);
            auVar84._0_8_ = CONCAT44(auVar15._4_4_ * 3.0,auVar15._0_4_ * 3.0);
            auVar84._8_4_ = auVar15._8_4_ * 3.0;
            auVar84._12_4_ = auVar15._12_4_ * 3.0;
            auVar275._8_8_ = auVar132._0_8_;
            auVar275._0_8_ = auVar132._0_8_;
            auVar15 = vshufpd_avx(auVar132,auVar132,3);
            auVar132 = vshufps_avx(auVar246,auVar246,0x55);
            auVar244 = vsubps_avx(auVar15,auVar275);
            auVar96 = vfmadd231ps_fma(auVar275,auVar132,auVar244);
            auVar283._8_8_ = auVar84._0_8_;
            auVar283._0_8_ = auVar84._0_8_;
            auVar15 = vshufpd_avx(auVar84,auVar84,3);
            auVar15 = vsubps_avx(auVar15,auVar283);
            auVar74 = vfmadd213ps_fma(auVar15,auVar132,auVar283);
            auVar132 = vmovshdup_avx(auVar74);
            auVar284._0_8_ = auVar132._0_8_ ^ 0x8000000080000000;
            auVar284._8_4_ = auVar132._8_4_ ^ 0x80000000;
            auVar284._12_4_ = auVar132._12_4_ ^ 0x80000000;
            auVar6 = vmovshdup_avx(auVar244);
            auVar15 = vunpcklps_avx(auVar6,auVar284);
            auVar252 = vshufps_avx(auVar15,auVar284,4);
            auVar131 = vshufps_avx(auVar246,auVar246,0x54);
            auVar134._0_8_ = auVar244._0_8_ ^ 0x8000000080000000;
            auVar134._8_4_ = auVar244._8_4_ ^ 0x80000000;
            auVar134._12_4_ = auVar244._12_4_ ^ 0x80000000;
            auVar15 = vmovlhps_avx(auVar134,auVar74);
            auVar15 = vshufps_avx(auVar15,auVar74,8);
            auVar132 = vfmsub231ss_fma(ZEXT416((uint)(auVar244._0_4_ * auVar132._0_4_)),auVar6,
                                       auVar74);
            uVar70 = auVar132._0_4_;
            auVar85._4_4_ = uVar70;
            auVar85._0_4_ = uVar70;
            auVar85._8_4_ = uVar70;
            auVar85._12_4_ = uVar70;
            auVar132 = vdivps_avx(auVar252,auVar85);
            auVar6 = vdivps_avx(auVar15,auVar85);
            fVar72 = auVar96._0_4_;
            fVar125 = auVar132._0_4_;
            auVar15 = vshufps_avx(auVar96,auVar96,0x55);
            fVar94 = auVar6._0_4_;
            auVar86._0_4_ = fVar72 * fVar125 + auVar15._0_4_ * fVar94;
            auVar86._4_4_ = fVar72 * auVar132._4_4_ + auVar15._4_4_ * auVar6._4_4_;
            auVar86._8_4_ = fVar72 * auVar132._8_4_ + auVar15._8_4_ * auVar6._8_4_;
            auVar86._12_4_ = fVar72 * auVar132._12_4_ + auVar15._12_4_ * auVar6._12_4_;
            auVar98 = vsubps_avx(auVar131,auVar86);
            auVar131 = vmovshdup_avx(auVar132);
            auVar15 = vinsertps_avx(auVar237,auVar267,0x1c);
            auVar155._0_4_ = auVar131._0_4_ * auVar15._0_4_;
            auVar155._4_4_ = auVar131._4_4_ * auVar15._4_4_;
            auVar155._8_4_ = auVar131._8_4_ * auVar15._8_4_;
            auVar155._12_4_ = auVar131._12_4_ * auVar15._12_4_;
            auVar252 = vinsertps_avx(auVar223,auVar253,0x1c);
            auVar102._0_4_ = auVar252._0_4_ * auVar131._0_4_;
            auVar102._4_4_ = auVar252._4_4_ * auVar131._4_4_;
            auVar102._8_4_ = auVar252._8_4_ * auVar131._8_4_;
            auVar102._12_4_ = auVar252._12_4_ * auVar131._12_4_;
            auVar96 = vminps_avx(auVar155,auVar102);
            auVar74 = vmaxps_avx(auVar102,auVar155);
            auVar131 = vinsertps_avx(auVar267,auVar237,0x4c);
            auVar128 = vmovshdup_avx(auVar6);
            auVar244 = vinsertps_avx(auVar253,auVar223,0x4c);
            auVar254._0_4_ = auVar128._0_4_ * auVar131._0_4_;
            auVar254._4_4_ = auVar128._4_4_ * auVar131._4_4_;
            auVar254._8_4_ = auVar128._8_4_ * auVar131._8_4_;
            auVar254._12_4_ = auVar128._12_4_ * auVar131._12_4_;
            auVar238._0_4_ = auVar128._0_4_ * auVar244._0_4_;
            auVar238._4_4_ = auVar128._4_4_ * auVar244._4_4_;
            auVar238._8_4_ = auVar128._8_4_ * auVar244._8_4_;
            auVar238._12_4_ = auVar128._12_4_ * auVar244._12_4_;
            auVar128 = vminps_avx(auVar254,auVar238);
            auVar268._0_4_ = auVar96._0_4_ + auVar128._0_4_;
            auVar268._4_4_ = auVar96._4_4_ + auVar128._4_4_;
            auVar268._8_4_ = auVar96._8_4_ + auVar128._8_4_;
            auVar268._12_4_ = auVar96._12_4_ + auVar128._12_4_;
            auVar96 = vmaxps_avx(auVar238,auVar254);
            auVar103._0_4_ = auVar96._0_4_ + auVar74._0_4_;
            auVar103._4_4_ = auVar96._4_4_ + auVar74._4_4_;
            auVar103._8_4_ = auVar96._8_4_ + auVar74._8_4_;
            auVar103._12_4_ = auVar96._12_4_ + auVar74._12_4_;
            auVar239._8_8_ = 0x3f80000000000000;
            auVar239._0_8_ = 0x3f80000000000000;
            auVar74 = vsubps_avx(auVar239,auVar103);
            auVar96 = vsubps_avx(auVar239,auVar268);
            auVar128 = vsubps_avx(auVar154,auVar246);
            auVar97 = vsubps_avx(auVar75,auVar246);
            auVar119._0_4_ = fVar125 * auVar15._0_4_;
            auVar119._4_4_ = fVar125 * auVar15._4_4_;
            auVar119._8_4_ = fVar125 * auVar15._8_4_;
            auVar119._12_4_ = fVar125 * auVar15._12_4_;
            auVar269._0_4_ = fVar125 * auVar252._0_4_;
            auVar269._4_4_ = fVar125 * auVar252._4_4_;
            auVar269._8_4_ = fVar125 * auVar252._8_4_;
            auVar269._12_4_ = fVar125 * auVar252._12_4_;
            auVar252 = vminps_avx(auVar119,auVar269);
            auVar15 = vmaxps_avx(auVar269,auVar119);
            auVar156._0_4_ = fVar94 * auVar131._0_4_;
            auVar156._4_4_ = fVar94 * auVar131._4_4_;
            auVar156._8_4_ = fVar94 * auVar131._8_4_;
            auVar156._12_4_ = fVar94 * auVar131._12_4_;
            auVar224._0_4_ = fVar94 * auVar244._0_4_;
            auVar224._4_4_ = fVar94 * auVar244._4_4_;
            auVar224._8_4_ = fVar94 * auVar244._8_4_;
            auVar224._12_4_ = fVar94 * auVar244._12_4_;
            auVar131 = vminps_avx(auVar156,auVar224);
            auVar270._0_4_ = auVar252._0_4_ + auVar131._0_4_;
            auVar270._4_4_ = auVar252._4_4_ + auVar131._4_4_;
            auVar270._8_4_ = auVar252._8_4_ + auVar131._8_4_;
            auVar270._12_4_ = auVar252._12_4_ + auVar131._12_4_;
            fVar263 = auVar128._0_4_;
            auVar276._0_4_ = fVar263 * auVar74._0_4_;
            fVar264 = auVar128._4_4_;
            auVar276._4_4_ = fVar264 * auVar74._4_4_;
            fVar197 = auVar128._8_4_;
            auVar276._8_4_ = fVar197 * auVar74._8_4_;
            fVar198 = auVar128._12_4_;
            auVar276._12_4_ = fVar198 * auVar74._12_4_;
            auVar252 = vmaxps_avx(auVar224,auVar156);
            auVar225._0_4_ = fVar263 * auVar96._0_4_;
            auVar225._4_4_ = fVar264 * auVar96._4_4_;
            auVar225._8_4_ = fVar197 * auVar96._8_4_;
            auVar225._12_4_ = fVar198 * auVar96._12_4_;
            fVar72 = auVar97._0_4_;
            auVar104._0_4_ = fVar72 * auVar74._0_4_;
            fVar164 = auVar97._4_4_;
            auVar104._4_4_ = fVar164 * auVar74._4_4_;
            fVar71 = auVar97._8_4_;
            auVar104._8_4_ = fVar71 * auVar74._8_4_;
            fVar232 = auVar97._12_4_;
            auVar104._12_4_ = fVar232 * auVar74._12_4_;
            auVar240._0_4_ = fVar72 * auVar96._0_4_;
            auVar240._4_4_ = fVar164 * auVar96._4_4_;
            auVar240._8_4_ = fVar71 * auVar96._8_4_;
            auVar240._12_4_ = fVar232 * auVar96._12_4_;
            auVar120._0_4_ = auVar15._0_4_ + auVar252._0_4_;
            auVar120._4_4_ = auVar15._4_4_ + auVar252._4_4_;
            auVar120._8_4_ = auVar15._8_4_ + auVar252._8_4_;
            auVar120._12_4_ = auVar15._12_4_ + auVar252._12_4_;
            auVar157._8_8_ = 0x3f800000;
            auVar157._0_8_ = 0x3f800000;
            auVar15 = vsubps_avx(auVar157,auVar120);
            auVar252 = vsubps_avx(auVar157,auVar270);
            auVar271._0_4_ = fVar263 * auVar15._0_4_;
            auVar271._4_4_ = fVar264 * auVar15._4_4_;
            auVar271._8_4_ = fVar197 * auVar15._8_4_;
            auVar271._12_4_ = fVar198 * auVar15._12_4_;
            auVar255._0_4_ = fVar263 * auVar252._0_4_;
            auVar255._4_4_ = fVar264 * auVar252._4_4_;
            auVar255._8_4_ = fVar197 * auVar252._8_4_;
            auVar255._12_4_ = fVar198 * auVar252._12_4_;
            auVar121._0_4_ = fVar72 * auVar15._0_4_;
            auVar121._4_4_ = fVar164 * auVar15._4_4_;
            auVar121._8_4_ = fVar71 * auVar15._8_4_;
            auVar121._12_4_ = fVar232 * auVar15._12_4_;
            auVar158._0_4_ = fVar72 * auVar252._0_4_;
            auVar158._4_4_ = fVar164 * auVar252._4_4_;
            auVar158._8_4_ = fVar71 * auVar252._8_4_;
            auVar158._12_4_ = fVar232 * auVar252._12_4_;
            auVar15 = vminps_avx(auVar271,auVar255);
            auVar252 = vminps_avx(auVar121,auVar158);
            auVar15 = vminps_avx(auVar15,auVar252);
            auVar252 = vmaxps_avx(auVar255,auVar271);
            auVar131 = vmaxps_avx(auVar158,auVar121);
            auVar244 = vminps_avx(auVar276,auVar225);
            auVar74 = vminps_avx(auVar104,auVar240);
            auVar244 = vminps_avx(auVar244,auVar74);
            auVar15 = vhaddps_avx(auVar15,auVar244);
            auVar252 = vmaxps_avx(auVar131,auVar252);
            auVar131 = vmaxps_avx(auVar225,auVar276);
            auVar244 = vmaxps_avx(auVar240,auVar104);
            auVar131 = vmaxps_avx(auVar244,auVar131);
            auVar252 = vhaddps_avx(auVar252,auVar131);
            auVar15 = vshufps_avx(auVar15,auVar15,0xe8);
            auVar252 = vshufps_avx(auVar252,auVar252,0xe8);
            auVar241._0_4_ = auVar98._0_4_ + auVar15._0_4_;
            auVar241._4_4_ = auVar98._4_4_ + auVar15._4_4_;
            auVar241._8_4_ = auVar98._8_4_ + auVar15._8_4_;
            auVar241._12_4_ = auVar98._12_4_ + auVar15._12_4_;
            auVar226._0_4_ = auVar98._0_4_ + auVar252._0_4_;
            auVar226._4_4_ = auVar98._4_4_ + auVar252._4_4_;
            auVar226._8_4_ = auVar98._8_4_ + auVar252._8_4_;
            auVar226._12_4_ = auVar98._12_4_ + auVar252._12_4_;
            auVar230 = ZEXT1664(auVar226);
            auVar15 = vmaxps_avx(auVar154,auVar241);
            auVar55._4_4_ = uStack_50c;
            auVar55._0_4_ = local_510;
            auVar55._8_4_ = uStack_508;
            auVar55._12_4_ = uStack_504;
            auVar252 = vminps_avx(auVar226,auVar75);
            auVar15 = vcmpps_avx(auVar252,auVar15,1);
            auVar15 = vshufps_avx(auVar15,auVar15,0x50);
            if ((auVar15 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar15[0xf]) {
              bVar63 = 0;
              if ((fVar203 < auVar241._0_4_) && (bVar63 = 0, auVar226._0_4_ < auVar75._0_4_)) {
                auVar252 = vmovshdup_avx(auVar241);
                auVar15 = vcmpps_avx(auVar226,auVar75,1);
                bVar63 = auVar15[4] & auVar114._0_4_ < auVar252._0_4_;
              }
              if (((3 < uVar68 || fVar93 < 0.001) | bVar63) != 1) goto LAB_017ae018;
              lVar62 = 200;
              do {
                fVar72 = auVar98._0_4_;
                fVar203 = 1.0 - fVar72;
                fVar93 = fVar203 * fVar203 * fVar203;
                fVar113 = fVar72 * 3.0 * fVar203 * fVar203;
                fVar203 = fVar203 * fVar72 * fVar72 * 3.0;
                auVar144._4_4_ = fVar93;
                auVar144._0_4_ = fVar93;
                auVar144._8_4_ = fVar93;
                auVar144._12_4_ = fVar93;
                auVar122._4_4_ = fVar113;
                auVar122._0_4_ = fVar113;
                auVar122._8_4_ = fVar113;
                auVar122._12_4_ = fVar113;
                auVar105._4_4_ = fVar203;
                auVar105._0_4_ = fVar203;
                auVar105._8_4_ = fVar203;
                auVar105._12_4_ = fVar203;
                fVar72 = fVar72 * fVar72 * fVar72;
                local_730 = auVar5._0_4_;
                fStack_72c = auVar5._4_4_;
                fStack_728 = auVar5._8_4_;
                fStack_724 = auVar5._12_4_;
                auVar159._0_4_ = fVar72 * local_730;
                auVar159._4_4_ = fVar72 * fStack_72c;
                auVar159._8_4_ = fVar72 * fStack_728;
                auVar159._12_4_ = fVar72 * fStack_724;
                auVar14 = vfmadd231ps_fma(auVar159,auVar105,auVar4);
                auVar14 = vfmadd231ps_fma(auVar14,auVar122,auVar3);
                auVar14 = vfmadd231ps_fma(auVar14,local_500,auVar144);
                auVar106._8_8_ = auVar14._0_8_;
                auVar106._0_8_ = auVar14._0_8_;
                auVar14 = vshufpd_avx(auVar14,auVar14,3);
                auVar15 = vshufps_avx(auVar98,auVar98,0x55);
                auVar14 = vsubps_avx(auVar14,auVar106);
                auVar15 = vfmadd213ps_fma(auVar14,auVar15,auVar106);
                fVar93 = auVar15._0_4_;
                auVar14 = vshufps_avx(auVar15,auVar15,0x55);
                auVar107._0_4_ = fVar125 * fVar93 + fVar94 * auVar14._0_4_;
                auVar107._4_4_ = auVar132._4_4_ * fVar93 + auVar6._4_4_ * auVar14._4_4_;
                auVar107._8_4_ = auVar132._8_4_ * fVar93 + auVar6._8_4_ * auVar14._8_4_;
                auVar107._12_4_ = auVar132._12_4_ * fVar93 + auVar6._12_4_ * auVar14._12_4_;
                auVar98 = vsubps_avx(auVar98,auVar107);
                auVar14 = vandps_avx(auVar55,auVar15);
                auVar15 = vshufps_avx(auVar14,auVar14,0xf5);
                auVar14 = vmaxss_avx(auVar15,auVar14);
                if (auVar14._0_4_ < (float)local_3b0._0_4_) {
                  local_120 = auVar98._0_4_;
                  if ((local_120 < 0.0) || (1.0 < local_120)) break;
                  auVar14 = vmovshdup_avx(auVar98);
                  fVar93 = auVar14._0_4_;
                  if ((fVar93 < 0.0) || (1.0 < fVar93)) break;
                  auVar15 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar244 = vinsertps_avx(auVar15,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                 [2]),0x28);
                  auVar15 = vdpps_avx(auVar244,local_520,0x7f);
                  auVar132 = vdpps_avx(auVar244,local_530,0x7f);
                  auVar6 = vdpps_avx(auVar244,local_3f0,0x7f);
                  auVar252 = vdpps_avx(auVar244,local_400,0x7f);
                  auVar154 = vdpps_avx(auVar244,local_410,0x7f);
                  auVar75 = vdpps_avx(auVar244,local_420,0x7f);
                  auVar131 = vdpps_avx(auVar244,local_430,0x7f);
                  auVar244 = vdpps_avx(auVar244,local_440,0x7f);
                  fVar113 = 1.0 - fVar93;
                  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar93 * auVar154._0_4_)),
                                            ZEXT416((uint)fVar113),auVar15);
                  auVar132 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * fVar93)),
                                             ZEXT416((uint)fVar113),auVar132);
                  auVar230 = ZEXT1664(auVar132);
                  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar131._0_4_ * fVar93)),
                                           ZEXT416((uint)fVar113),auVar6);
                  auVar252 = vfmadd231ss_fma(ZEXT416((uint)(fVar93 * auVar244._0_4_)),
                                             ZEXT416((uint)fVar113),auVar252);
                  fVar94 = 1.0 - local_120;
                  fVar113 = fVar94 * local_120 * local_120 * 3.0;
                  fVar164 = local_120 * local_120 * local_120;
                  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar164 * auVar252._0_4_)),
                                           ZEXT416((uint)fVar113),auVar6);
                  fVar203 = local_120 * 3.0 * fVar94 * fVar94;
                  auVar132 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar203),auVar132);
                  fVar125 = fVar94 * fVar94 * fVar94;
                  auVar15 = vfmadd231ss_fma(auVar132,ZEXT416((uint)fVar125),auVar15);
                  fVar72 = auVar15._0_4_;
                  if (((fVar72 < fVar69) ||
                      (fVar71 = *(float *)(ray + k * 4 + 0x100), fVar71 < fVar72)) ||
                     (pGVar10 = (context->scene->geometries).items[uVar59].ptr,
                     (pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0)) break;
                  auVar15 = vshufps_avx(auVar98,auVar98,0x55);
                  auVar227._8_4_ = 0x3f800000;
                  auVar227._0_8_ = 0x3f8000003f800000;
                  auVar227._12_4_ = 0x3f800000;
                  auVar132 = vsubps_avx(auVar227,auVar15);
                  fVar232 = auVar15._0_4_;
                  auVar242._0_4_ = fVar232 * (float)local_550._0_4_;
                  fVar263 = auVar15._4_4_;
                  auVar242._4_4_ = fVar263 * (float)local_550._4_4_;
                  fVar264 = auVar15._8_4_;
                  auVar242._8_4_ = fVar264 * fStack_548;
                  fVar197 = auVar15._12_4_;
                  auVar242._12_4_ = fVar197 * fStack_544;
                  auVar247._0_4_ = fVar232 * (float)local_590._0_4_;
                  auVar247._4_4_ = fVar263 * (float)local_590._4_4_;
                  auVar247._8_4_ = fVar264 * fStack_588;
                  auVar247._12_4_ = fVar197 * fStack_584;
                  auVar256._0_4_ = fVar232 * (float)local_5a0._0_4_;
                  auVar256._4_4_ = fVar263 * (float)local_5a0._4_4_;
                  auVar256._8_4_ = fVar264 * fStack_598;
                  auVar256._12_4_ = fVar197 * fStack_594;
                  auVar209._0_4_ = fVar232 * fVar163;
                  auVar209._4_4_ = fVar263 * fVar182;
                  auVar209._8_4_ = fVar264 * fVar183;
                  auVar209._12_4_ = fVar197 * fVar184;
                  auVar15 = vfmadd231ps_fma(auVar242,auVar132,local_540);
                  auVar6 = vfmadd231ps_fma(auVar247,auVar132,local_570);
                  auVar252 = vfmadd231ps_fma(auVar256,auVar132,local_580);
                  auVar154 = vfmadd231ps_fma(auVar209,auVar132,local_560);
                  auVar132 = vsubps_avx(auVar6,auVar15);
                  auVar230 = ZEXT1664(auVar132);
                  auVar15 = vsubps_avx(auVar252,auVar6);
                  auVar6 = vsubps_avx(auVar154,auVar252);
                  auVar257._0_4_ = local_120 * auVar15._0_4_;
                  auVar257._4_4_ = local_120 * auVar15._4_4_;
                  auVar257._8_4_ = local_120 * auVar15._8_4_;
                  auVar257._12_4_ = local_120 * auVar15._12_4_;
                  auVar191._4_4_ = fVar94;
                  auVar191._0_4_ = fVar94;
                  auVar191._8_4_ = fVar94;
                  auVar191._12_4_ = fVar94;
                  auVar252 = vfmadd231ps_fma(auVar257,auVar191,auVar132);
                  auVar210._0_4_ = local_120 * auVar6._0_4_;
                  auVar210._4_4_ = local_120 * auVar6._4_4_;
                  auVar210._8_4_ = local_120 * auVar6._8_4_;
                  auVar210._12_4_ = local_120 * auVar6._12_4_;
                  auVar15 = vfmadd231ps_fma(auVar210,auVar191,auVar15);
                  auVar211._0_4_ = local_120 * auVar15._0_4_;
                  auVar211._4_4_ = local_120 * auVar15._4_4_;
                  auVar211._8_4_ = local_120 * auVar15._8_4_;
                  auVar211._12_4_ = local_120 * auVar15._12_4_;
                  auVar6 = vfmadd231ps_fma(auVar211,auVar191,auVar252);
                  auVar179._0_4_ = fVar164 * (float)local_490._0_4_;
                  auVar179._4_4_ = fVar164 * (float)local_490._4_4_;
                  auVar179._8_4_ = fVar164 * fStack_488;
                  auVar179._12_4_ = fVar164 * fStack_484;
                  auVar135._4_4_ = fVar113;
                  auVar135._0_4_ = fVar113;
                  auVar135._8_4_ = fVar113;
                  auVar135._12_4_ = fVar113;
                  auVar15 = vfmadd132ps_fma(auVar135,auVar179,local_480);
                  auVar160._4_4_ = fVar203;
                  auVar160._0_4_ = fVar203;
                  auVar160._8_4_ = fVar203;
                  auVar160._12_4_ = fVar203;
                  auVar15 = vfmadd132ps_fma(auVar160,auVar15,local_470);
                  auVar180._0_4_ = auVar6._0_4_ * 3.0;
                  auVar180._4_4_ = auVar6._4_4_ * 3.0;
                  auVar180._8_4_ = auVar6._8_4_ * 3.0;
                  auVar180._12_4_ = auVar6._12_4_ * 3.0;
                  auVar145._4_4_ = fVar125;
                  auVar145._0_4_ = fVar125;
                  auVar145._8_4_ = fVar125;
                  auVar145._12_4_ = fVar125;
                  auVar6 = vfmadd132ps_fma(auVar145,auVar15,local_460);
                  auVar15 = vshufps_avx(auVar180,auVar180,0xc9);
                  auVar136._0_4_ = auVar6._0_4_ * auVar15._0_4_;
                  auVar136._4_4_ = auVar6._4_4_ * auVar15._4_4_;
                  auVar136._8_4_ = auVar6._8_4_ * auVar15._8_4_;
                  auVar136._12_4_ = auVar6._12_4_ * auVar15._12_4_;
                  auVar15 = vshufps_avx(auVar6,auVar6,0xc9);
                  auVar15 = vfmsub231ps_fma(auVar136,auVar180,auVar15);
                  local_140 = auVar15._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar72;
                    uVar70 = vextractps_avx(auVar15,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar70;
                    uVar70 = vextractps_avx(auVar15,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar70;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                    *(float *)(ray + k * 4 + 0x1e0) = local_120;
                    *(float *)(ray + k * 4 + 0x200) = fVar93;
                    *(uint *)(ray + k * 4 + 0x220) = uVar9;
                    *(uint *)(ray + k * 4 + 0x240) = uVar59;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  local_100 = auVar14._0_8_;
                  auVar14 = vmovshdup_avx(auVar15);
                  local_180 = auVar14._0_8_;
                  auVar14 = vshufps_avx(auVar15,auVar15,0xaa);
                  local_160 = auVar14._0_8_;
                  uStack_178 = local_180;
                  uStack_170 = local_180;
                  uStack_168 = local_180;
                  uStack_158 = local_160;
                  uStack_150 = local_160;
                  uStack_148 = local_160;
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  fStack_11c = local_120;
                  fStack_118 = local_120;
                  fStack_114 = local_120;
                  fStack_110 = local_120;
                  fStack_10c = local_120;
                  fStack_108 = local_120;
                  fStack_104 = local_120;
                  uStack_f8 = local_100;
                  uStack_f0 = local_100;
                  uStack_e8 = local_100;
                  local_e0 = CONCAT44(uStack_33c,local_340);
                  uStack_d8 = CONCAT44(uStack_334,uStack_338);
                  uStack_d0 = CONCAT44(uStack_32c,uStack_330);
                  uStack_c8 = CONCAT44(uStack_324,uStack_328);
                  local_c0._4_4_ = uStack_31c;
                  local_c0._0_4_ = local_320;
                  local_c0._8_4_ = uStack_318;
                  local_c0._12_4_ = uStack_314;
                  local_c0._16_4_ = uStack_310;
                  local_c0._20_4_ = uStack_30c;
                  local_c0._24_4_ = uStack_308;
                  local_c0._28_4_ = uStack_304;
                  vpcmpeqd_avx2(local_c0,local_c0);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar72;
                  local_4c0 = local_360;
                  local_5f0.valid = (int *)local_4c0;
                  local_5f0.geometryUserPtr = pGVar10->userPtr;
                  local_5f0.context = context->user;
                  local_5f0.hit = (RTCHitN *)&local_180;
                  local_5f0.N = 8;
                  local_5f0.ray = (RTCRayN *)ray;
                  if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar230 = ZEXT1664(auVar132);
                    (*pGVar10->intersectionFilterN)(&local_5f0);
                  }
                  auVar87 = vpcmpeqd_avx2(local_4c0,_DAT_01faff00);
                  auVar87 = _DAT_01fe9960 & ~auVar87;
                  if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar87 >> 0x7f,0) != '\0') ||
                        (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar87 >> 0xbf,0) != '\0') ||
                      (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar87[0x1f] < '\0') {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar230 = ZEXT1664(auVar230._0_16_);
                      (*p_Var11)(&local_5f0);
                    }
                    auVar16 = vpcmpeqd_avx2(local_4c0,_DAT_01faff00);
                    auVar87 = _DAT_01fe9960 & ~auVar16;
                    if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar87 >> 0x7f,0) != '\0') ||
                          (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar87 >> 0xbf,0) != '\0') ||
                        (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar87[0x1f] < '\0') {
                      auVar91._0_8_ = auVar16._0_8_ ^ 0xffffffffffffffff;
                      auVar91._8_4_ = auVar16._8_4_ ^ 0xffffffff;
                      auVar91._12_4_ = auVar16._12_4_ ^ 0xffffffff;
                      auVar91._16_4_ = auVar16._16_4_ ^ 0xffffffff;
                      auVar91._20_4_ = auVar16._20_4_ ^ 0xffffffff;
                      auVar91._24_4_ = auVar16._24_4_ ^ 0xffffffff;
                      auVar91._28_4_ = auVar16._28_4_ ^ 0xffffffff;
                      auVar87 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])local_5f0.hit);
                      *(undefined1 (*) [32])(local_5f0.ray + 0x180) = auVar87;
                      auVar87 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])(local_5f0.hit + 0x20))
                      ;
                      *(undefined1 (*) [32])(local_5f0.ray + 0x1a0) = auVar87;
                      auVar87 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])(local_5f0.hit + 0x40))
                      ;
                      *(undefined1 (*) [32])(local_5f0.ray + 0x1c0) = auVar87;
                      auVar87 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])(local_5f0.hit + 0x60))
                      ;
                      *(undefined1 (*) [32])(local_5f0.ray + 0x1e0) = auVar87;
                      auVar87 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])(local_5f0.hit + 0x80))
                      ;
                      *(undefined1 (*) [32])(local_5f0.ray + 0x200) = auVar87;
                      auVar87 = vpmaskmovd_avx2(auVar91,*(undefined1 (*) [32])(local_5f0.hit + 0xa0)
                                               );
                      *(undefined1 (*) [32])(local_5f0.ray + 0x220) = auVar87;
                      auVar87 = vpmaskmovd_avx2(auVar91,*(undefined1 (*) [32])(local_5f0.hit + 0xc0)
                                               );
                      *(undefined1 (*) [32])(local_5f0.ray + 0x240) = auVar87;
                      auVar87 = vpmaskmovd_avx2(auVar91,*(undefined1 (*) [32])(local_5f0.hit + 0xe0)
                                               );
                      *(undefined1 (*) [32])(local_5f0.ray + 0x260) = auVar87;
                      auVar87 = vpmaskmovd_avx2(auVar91,*(undefined1 (*) [32])
                                                         (local_5f0.hit + 0x100));
                      *(undefined1 (*) [32])(local_5f0.ray + 0x280) = auVar87;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar71;
                  break;
                }
                lVar62 = lVar62 + -1;
              } while (lVar62 != 0);
            }
          }
        }
        else {
          auVar252 = vcmpps_avx(auVar252,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar131 = vcmpps_avx(auVar154,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar252 = vandps_avx(auVar131,auVar252);
          if (-0.0001 < fVar94 && (auVar252 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_017ad39c;
        }
        if (uVar68 == 0) break;
      } while( true );
    }
    uVar70 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar92._4_4_ = uVar70;
    auVar92._0_4_ = uVar70;
    auVar92._8_4_ = uVar70;
    auVar92._12_4_ = uVar70;
    auVar92._16_4_ = uVar70;
    auVar92._20_4_ = uVar70;
    auVar92._24_4_ = uVar70;
    auVar92._28_4_ = uVar70;
    auVar87 = vcmpps_avx(local_300,auVar92,2);
    uVar59 = vmovmskps_avx(auVar87);
    uVar59 = (uint)uVar67 & uVar59;
    if (uVar59 == 0) {
      return;
    }
  } while( true );
LAB_017ae018:
  local_450 = vinsertps_avx(auVar14,ZEXT416((uint)fVar113),0x10);
  auVar75 = vinsertps_avx(auVar114,ZEXT416((uint)auVar115._0_4_),0x10);
  goto LAB_017acae1;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }